

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLaplacian_misc.cpp
# Opt level: O1

void __thiscall
amrex::MLNodeLaplacian::Fsmooth
          (MLNodeLaplacian *this,int amrlev,int mglev,MultiFab *sol,MultiFab *rhs)

{
  undefined1 (*pauVar1) [16];
  Real RVar2;
  double dVar3;
  _func_int **pp_Var4;
  double dVar5;
  double dVar6;
  _func_int **pp_Var7;
  double dVar8;
  _func_int **pp_Var9;
  double dVar10;
  _func_int **pp_Var11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  _func_int **pp_Var17;
  double dVar18;
  _func_int **pp_Var19;
  _func_int **pp_Var20;
  double dVar21;
  double dVar22;
  _func_int **pp_Var23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  _func_int **pp_Var28;
  _func_int **pp_Var29;
  _func_int **pp_Var30;
  _func_int **pp_Var31;
  _func_int **pp_Var32;
  _func_int **pp_Var33;
  _func_int **pp_Var34;
  _func_int **pp_Var35;
  _func_int **pp_Var36;
  _func_int **pp_Var37;
  _func_int **pp_Var38;
  _func_int **pp_Var39;
  _func_int **pp_Var40;
  _func_int **pp_Var41;
  _func_int **pp_Var42;
  _func_int **pp_Var43;
  _func_int **pp_Var44;
  pointer pIVar45;
  FabArray<amrex::IArrayBox> *this_00;
  double dVar46;
  undefined1 auVar47 [8];
  double dVar48;
  double dVar49;
  uint uVar50;
  undefined1 auVar51 [16];
  int iVar52;
  int iVar53;
  int iVar54;
  int iVar55;
  _Alloc_hider *p_Var56;
  _Alloc_hider *p_Var57;
  uint uVar58;
  int iVar59;
  long lVar60;
  long lVar61;
  long lVar62;
  int iVar63;
  ulong uVar64;
  long lVar65;
  undefined8 *puVar66;
  long lVar67;
  long lVar68;
  int *piVar69;
  uint uVar70;
  long lVar71;
  long lVar72;
  uint uVar73;
  long lVar74;
  ulong uVar75;
  long lVar76;
  long lVar77;
  long lVar78;
  long lVar79;
  int iVar80;
  long lVar81;
  long lVar82;
  long lVar83;
  int iVar84;
  long lVar85;
  long lVar86;
  int iVar87;
  long lVar88;
  long lVar89;
  long *plVar90;
  long lVar91;
  uint uVar92;
  long lVar93;
  double *pdVar94;
  long lVar95;
  bool bVar96;
  bool bVar97;
  double dVar98;
  double dVar99;
  double dVar100;
  double dVar101;
  double dVar102;
  double dVar103;
  Real facz;
  Real facy;
  Real facx;
  Real f2x2ymz;
  MFIter mfi_2;
  Array1D<double,_0,_31> u_ls;
  Array1D<double,_0,_31> c_ls;
  Array1D<double,_0,_31> r_ls;
  Array1D<double,_0,_31> a_ls;
  MFIter mfi;
  undefined1 local_c68 [16];
  long local_c28;
  long local_c10;
  long local_c08;
  int local_bfc;
  double *local_bf8;
  long local_be0;
  long local_bd8;
  int local_bd0;
  long local_bb8;
  long local_bb0;
  ulong local_ba8;
  ulong local_ba0;
  long local_b98;
  long local_b90;
  long local_b68;
  long local_b60;
  long local_b58;
  long local_b50;
  long local_b48;
  long local_b08;
  long local_b00;
  long local_af8;
  long local_ae8;
  undefined8 uStack_ae0;
  Array4<const_double> local_ad8;
  long local_a98;
  _Alloc_hider *local_a90;
  _Alloc_hider *local_a88;
  double local_a80;
  double local_a78;
  long local_a70;
  _Alloc_hider *local_a68;
  _Alloc_hider *local_a60;
  int local_a58;
  int local_a54;
  int local_a50;
  int local_a4c;
  Array4<const_double> local_a48;
  long local_a08;
  long local_a00;
  ulong local_9f8;
  ulong local_9f0;
  long local_9e8;
  ulong local_9e0;
  long local_9d8;
  ulong local_9d0;
  long local_9c8;
  long local_9c0;
  ulong local_9b8;
  FabArrayBase *local_9b0;
  _Alloc_hider *local_9a8;
  _Alloc_hider *local_9a0;
  _Alloc_hider *local_998;
  _Alloc_hider *local_990;
  double local_988;
  uint local_97c;
  uint local_978;
  uint local_974;
  int local_970;
  int local_96c;
  Array4<const_double> local_968;
  Array4<const_int> local_928;
  undefined1 local_8e8 [24];
  FabArrayBase *pFStack_8d0;
  int local_8c8;
  int iStack_8c4;
  int iStack_8c0;
  int iStack_8b4;
  uint local_8b0;
  undefined4 uStack_8ac;
  Box local_884;
  double local_868;
  double dStack_860;
  double local_858;
  double dStack_850;
  undefined1 local_848 [16];
  double local_838;
  double dStack_830;
  double local_828;
  double dStack_820;
  double local_818;
  double dStack_810;
  double local_808;
  double dStack_800;
  double local_7f0;
  undefined1 local_7e8 [40];
  int iStack_7c0;
  int iStack_7bc;
  int iStack_7b8;
  undefined8 uStack_7b4;
  undefined1 local_6e8 [24];
  FabArrayBase *pFStack_6d0;
  int local_6c8;
  int iStack_6c4;
  int iStack_6c0;
  int iStack_6bc;
  IndexType IStack_6b8;
  undefined8 uStack_6b4;
  undefined1 local_5e8 [40];
  int iStack_5c0;
  int iStack_5bc;
  int iStack_5b8;
  undefined8 uStack_5b4;
  undefined1 local_4e8 [24];
  FabArrayBase *pFStack_4d0;
  FabArrayBase *local_4c8;
  undefined8 uStack_4b4;
  _Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_> local_4a8;
  FabArrayBase *pFStack_4a0;
  FabArrayBase *local_498;
  FabArrayBase *pFStack_490;
  FabArrayBase *pFStack_488;
  undefined8 uStack_474;
  _Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_> local_468;
  tuple<amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_> tStack_460;
  FabArrayBase *local_458;
  FabArrayBase *pFStack_450;
  FabArrayBase *pFStack_448;
  undefined8 uStack_440;
  undefined8 uStack_438;
  uint uStack_430;
  int iStack_42c;
  int local_428;
  undefined4 uStack_424;
  FabArrayBase *pFStack_420;
  FabArrayBase *local_418;
  FabArrayBase *pFStack_410;
  int local_408;
  int iStack_404;
  int iStack_400;
  int iStack_3fc;
  int iStack_3f8;
  int iStack_3f4;
  int iStack_3f0;
  int iStack_3ec;
  undefined8 uStack_3e8;
  int iStack_3e0;
  undefined4 uStack_3dc;
  undefined8 local_3d8;
  FabArrayBase *pFStack_3d0;
  int iStack_3c8;
  int iStack_3c4;
  int local_3c0;
  int iStack_3bc;
  int iStack_3b8;
  int iStack_3b4;
  int iStack_3b0;
  int iStack_3ac;
  int iStack_3a8;
  undefined8 uStack_3a0;
  int iStack_398;
  undefined4 uStack_394;
  FabArrayBase *local_390;
  FabArrayBase *pFStack_388;
  FabArrayBase *local_380;
  FabArrayBase *pFStack_378;
  int local_364;
  int iStack_360;
  double dStack_358;
  FabArrayBase *local_350;
  FabArrayBase *pFStack_348;
  FabArrayBase *local_340;
  FabArrayBase *pFStack_338;
  FabArrayBase *pFStack_330;
  undefined8 uStack_31c;
  undefined1 local_308 [256];
  undefined1 local_208 [16];
  double local_1f8;
  double dStack_1f0;
  FabArrayBase *local_1e8;
  FabArrayBase *pFStack_1e0;
  FabArrayBase *local_1d8;
  double dStack_1d0;
  double local_1c8;
  double dStack_1c0;
  undefined1 local_1b0 [8];
  FabArrayBase *local_1a8 [47];
  
  lVar85 = (long)mglev;
  lVar67 = *(long *)&(this->super_MLNodeLinOp).super_MLLinOp.m_geom.
                     super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[amrlev].
                     super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                     super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  bVar96 = true;
  if (0 < mglev && amrlev == 0) {
    pIVar45 = (this->super_MLNodeLinOp).super_MLLinOp.mg_coarsen_ratio_vec.
              super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
              super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
              super__Vector_impl_data._M_start;
    bVar96 = false;
    if ((pIVar45[(ulong)(uint)mglev - 1].vect[0] == 2) &&
       (pIVar45[(ulong)(uint)mglev - 1].vect[1] == 2)) {
      bVar96 = pIVar45[(ulong)(uint)mglev - 1].vect[2] == 2;
    }
  }
  plVar90 = (long *)(lVar85 * 0x18 +
                    *(long *)&(this->m_sigma).
                              super_vector<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
                              .
                              super__Vector_base<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[amrlev].
                              super_vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
                              .
                              super__Vector_base<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
                    );
  lVar76 = *(long *)&(this->m_stencil).
                     super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[amrlev].
                     super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                     .
                     super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ;
  pauVar1 = (undefined1 (*) [16])(lVar67 + 0x38 + lVar85 * 200);
  dVar100 = *(double *)*pauVar1;
  dVar3 = *(double *)(*pauVar1 + 8);
  local_c68 = *pauVar1;
  dVar98 = *(double *)(lVar67 + 0x48 + lVar85 * 200);
  this_00 = *(FabArray<amrex::IArrayBox> **)
             (*(long *)&(this->super_MLNodeLinOp).m_dirichlet_mask.
                        super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                        .
                        super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[amrlev].
                        super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                        .
                        super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
             + lVar85 * 8);
  local_a58 = amrlev;
  local_a54 = mglev;
  if ((!bVar96) && (*plVar90 == 0)) {
    Assert_host("regular_coarsening",
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLNodeLaplacian_misc.cpp"
                ,0x1a9,(char *)0x0);
  }
  iVar87 = local_a54;
  if (this->m_use_gauss_seidel != true) {
    local_4e8._0_8_ = (FabArrayBase *)0x1;
    local_4e8._8_8_ = (FabArrayBase *)0x0;
    local_4e8._16_8_ = (FabArrayBase *)0x0;
    pFStack_4d0 = (FabArrayBase *)0x0;
    local_4c8 = (FabArrayBase *)0x0;
    local_6e8._0_8_ = &PTR__FabFactory_008378d0;
    MultiFab::MultiFab((MultiFab *)local_1b0,
                       &(sol->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray,
                       &(sol->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap,1
                       ,0,(MFInfo *)local_4e8,(FabFactory<amrex::FArrayBox> *)local_6e8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_4e8 + 0x10));
    Fapply(this,local_a58,iVar87,(MultiFab *)local_1b0,sol);
    if ((this->super_MLNodeLinOp).m_coarsening_strategy == RAP) {
      MFIter::MFIter((MFIter *)local_6e8,(FabArrayBase *)sol,true);
      if (local_6c8 < iStack_6c0) {
        do {
          MFIter::tilebox((Box *)&local_ad8,(MFIter *)local_6e8);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<double> *)local_7e8,&sol->super_FabArray<amrex::FArrayBox>,
                     (MFIter *)local_6e8);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((Array4<const_double> *)local_5e8,(FabArray<amrex::FArrayBox> *)local_1b0,
                     (MFIter *)local_6e8);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((Array4<const_double> *)local_308,&rhs->super_FabArray<amrex::FArrayBox>,
                     (MFIter *)local_6e8);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((Array4<const_double> *)local_8e8,
                     *(FabArray<amrex::FArrayBox> **)(lVar76 + lVar85 * 8),(MFIter *)local_6e8);
          FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                    ((Array4<const_int> *)&local_a48,this_00,(MFIter *)local_6e8);
          local_4c8 = (FabArrayBase *)CONCAT44(local_a48.begin.y,local_a48.begin.x);
          uStack_4b4 = local_a48._52_8_;
          local_4e8._16_8_ = local_a48.kstride;
          pFStack_4d0 = (FabArrayBase *)local_a48.nstride;
          local_4e8._0_8_ = local_a48.p;
          local_4e8._8_8_ = local_a48.jstride;
          uStack_474 = uStack_7b4;
          pFStack_488 = (FabArrayBase *)local_7e8._32_8_;
          local_498 = (FabArrayBase *)local_7e8._16_8_;
          pFStack_490 = (FabArrayBase *)local_7e8._24_8_;
          local_4a8.super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
               (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)
               (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)local_7e8._0_8_;
          pFStack_4a0 = (FabArrayBase *)local_7e8._8_8_;
          pFStack_448 = (FabArrayBase *)CONCAT44(iStack_8c4,local_8c8);
          uStack_438._4_4_ = iStack_8b4;
          uStack_430 = local_8b0;
          local_458 = (FabArrayBase *)local_8e8._16_8_;
          pFStack_450 = pFStack_8d0;
          local_468.super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
               (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)
               (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)local_8e8._0_8_;
          tStack_460.
          super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
          super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
               (_Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>)
               (_Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>)
               local_8e8._8_8_;
          iStack_3f4 = (int)local_308._52_8_;
          iStack_3f0 = SUB84(local_308._52_8_,4);
          local_408 = (int)local_308._32_8_;
          iStack_404 = SUB84(local_308._32_8_,4);
          local_418 = (FabArrayBase *)local_308._16_8_;
          pFStack_410 = (FabArrayBase *)local_308._24_8_;
          local_428 = (int)local_308._0_8_;
          uStack_424 = SUB84(local_308._0_8_,4);
          pFStack_420 = (FabArrayBase *)local_308._8_8_;
          iStack_3b4 = (int)uStack_5b4;
          iStack_3b0 = SUB84(uStack_5b4,4);
          iStack_3c8 = (int)local_5e8._32_8_;
          iStack_3c4 = SUB84(local_5e8._32_8_,4);
          local_3c0 = iStack_5c0;
          iStack_3bc = iStack_5bc;
          local_3d8 = (FabArrayBase *)local_5e8._16_8_;
          pFStack_3d0 = (FabArrayBase *)local_5e8._24_8_;
          uStack_3e8._0_4_ = (int)local_5e8._0_8_;
          uStack_3e8._4_4_ = SUB84(local_5e8._0_8_,4);
          iStack_3e0 = (int)local_5e8._8_8_;
          uStack_3dc = SUB84(local_5e8._8_8_,4);
          LoopConcurrent<amrex::mlndlap_jacobi_sten(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<int_const>const&)::_lambda(int,int,int)_1_>
                    ((Box *)&local_ad8,(anon_class_320_5_f501ae73 *)local_4e8);
          MFIter::operator++((MFIter *)local_6e8);
        } while (local_6c8 < iStack_6c0);
      }
    }
    else if (*plVar90 == 0) {
      RVar2 = this->m_const_sigma;
      MFIter::MFIter((MFIter *)local_6e8,(FabArrayBase *)sol,true);
      if (local_6c8 < iStack_6c0) {
        do {
          MFIter::tilebox((Box *)&local_a48,(MFIter *)local_6e8);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<double> *)local_7e8,&sol->super_FabArray<amrex::FArrayBox>,
                     (MFIter *)local_6e8);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((Array4<const_double> *)local_5e8,(FabArray<amrex::FArrayBox> *)local_1b0,
                     (MFIter *)local_6e8);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((Array4<const_double> *)local_308,&rhs->super_FabArray<amrex::FArrayBox>,
                     (MFIter *)local_6e8);
          FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                    ((Array4<const_int> *)local_8e8,this_00,(MFIter *)local_6e8);
          local_4c8 = (FabArrayBase *)CONCAT44(iStack_8c4,local_8c8);
          uStack_4b4._4_4_ = local_8b0;
          uStack_4b4._0_4_ = iStack_8b4;
          local_4e8._16_8_ = local_8e8._16_8_;
          pFStack_4d0 = pFStack_8d0;
          local_4e8._0_8_ = local_8e8._0_8_;
          local_4e8._8_8_ = local_8e8._8_8_;
          uStack_474 = uStack_7b4;
          pFStack_488 = (FabArrayBase *)local_7e8._32_8_;
          local_498 = (FabArrayBase *)local_7e8._16_8_;
          pFStack_490 = (FabArrayBase *)local_7e8._24_8_;
          local_4a8.super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
               (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)
               (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)local_7e8._0_8_;
          pFStack_4a0 = (FabArrayBase *)local_7e8._8_8_;
          uStack_438._4_4_ = (int)local_308._52_8_;
          uStack_430 = SUB84(local_308._52_8_,4);
          pFStack_448 = (FabArrayBase *)local_308._32_8_;
          local_458 = (FabArrayBase *)local_308._16_8_;
          pFStack_450 = (FabArrayBase *)local_308._24_8_;
          local_468.super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
               (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)
               (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)local_308._0_8_;
          tStack_460.
          super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
          super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
               (_Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>)
               (_Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>)
               local_308._8_8_;
          iStack_3f4 = (int)uStack_5b4;
          iStack_3f0 = SUB84(uStack_5b4,4);
          local_408 = (int)local_5e8._32_8_;
          iStack_404 = SUB84(local_5e8._32_8_,4);
          local_418 = (FabArrayBase *)local_5e8._16_8_;
          pFStack_410 = (FabArrayBase *)local_5e8._24_8_;
          local_428 = (int)local_5e8._0_8_;
          uStack_424 = SUB84(local_5e8._0_8_,4);
          pFStack_420 = (FabArrayBase *)local_5e8._8_8_;
          iStack_3e0 = SUB84(RVar2,0);
          uStack_3dc = (undefined4)((ulong)RVar2 >> 0x20);
          uStack_3e8 = (double *)
                       ((dVar98 * dVar98 + dVar100 * dVar100 + dVar3 * dVar3) * -0.1111111111111111)
          ;
          LoopConcurrent<amrex::mlndlap_jacobi_c(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,double,amrex::Array4<int_const>const&,amrex::GpuArray<double,3u>const&)::_lambda(int,int,int)_1_>
                    ((Box *)&local_a48,(anon_class_272_6_f7bd19c5 *)local_4e8);
          MFIter::operator++((MFIter *)local_6e8);
        } while (local_6c8 < iStack_6c0);
      }
    }
    else if (((iVar87 < 1) || (this->m_use_harmonic_average == false)) &&
            (this->m_use_mapped != true)) {
      MFIter::MFIter((MFIter *)local_6e8,(FabArrayBase *)sol,true);
      if (local_6c8 < iStack_6c0) {
        do {
          MFIter::tilebox((Box *)&local_ad8,(MFIter *)local_6e8);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((Array4<const_double> *)local_7e8,(FabArray<amrex::FArrayBox> *)*plVar90,
                     (MFIter *)local_6e8);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<double> *)local_5e8,&sol->super_FabArray<amrex::FArrayBox>,
                     (MFIter *)local_6e8);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((Array4<const_double> *)local_308,(FabArray<amrex::FArrayBox> *)local_1b0,
                     (MFIter *)local_6e8);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((Array4<const_double> *)local_8e8,&rhs->super_FabArray<amrex::FArrayBox>,
                     (MFIter *)local_6e8);
          FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                    ((Array4<const_int> *)&local_a48,this_00,(MFIter *)local_6e8);
          local_4c8 = (FabArrayBase *)CONCAT44(local_a48.begin.y,local_a48.begin.x);
          uStack_4b4 = local_a48._52_8_;
          local_4e8._16_8_ = local_a48.kstride;
          pFStack_4d0 = (FabArrayBase *)local_a48.nstride;
          local_4e8._0_8_ = local_a48.p;
          local_4e8._8_8_ = local_a48.jstride;
          uStack_474 = uStack_5b4;
          pFStack_488 = (FabArrayBase *)local_5e8._32_8_;
          local_498 = (FabArrayBase *)local_5e8._16_8_;
          pFStack_490 = (FabArrayBase *)local_5e8._24_8_;
          local_4a8.super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
               (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)
               (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)local_5e8._0_8_;
          pFStack_4a0 = (FabArrayBase *)local_5e8._8_8_;
          pFStack_448 = (FabArrayBase *)CONCAT44(iStack_8c4,local_8c8);
          uStack_438._4_4_ = iStack_8b4;
          uStack_430 = local_8b0;
          local_458 = (FabArrayBase *)local_8e8._16_8_;
          pFStack_450 = pFStack_8d0;
          local_468.super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
               (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)
               (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)local_8e8._0_8_;
          tStack_460.
          super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
          super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
               (_Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>)
               (_Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>)
               local_8e8._8_8_;
          iStack_3f4 = (int)local_308._52_8_;
          iStack_3f0 = SUB84(local_308._52_8_,4);
          local_408 = (int)local_308._32_8_;
          iStack_404 = SUB84(local_308._32_8_,4);
          local_418 = (FabArrayBase *)local_308._16_8_;
          pFStack_410 = (FabArrayBase *)local_308._24_8_;
          local_428 = (int)local_308._0_8_;
          uStack_424 = SUB84(local_308._0_8_,4);
          pFStack_420 = (FabArrayBase *)local_308._8_8_;
          iStack_3b0 = iStack_7b8;
          iStack_3ac = (int)uStack_7b4;
          iStack_3a8 = SUB84(uStack_7b4,4);
          local_3c0 = (int)local_7e8._32_8_;
          iStack_3bc = SUB84(local_7e8._32_8_,4);
          iStack_3b4 = iStack_7bc;
          pFStack_3d0 = (FabArrayBase *)local_7e8._16_8_;
          iStack_3c8 = (int)local_7e8._24_8_;
          iStack_3c4 = SUB84(local_7e8._24_8_,4);
          iStack_3e0 = (int)local_7e8._0_8_;
          uStack_3dc = SUB84(local_7e8._0_8_,4);
          local_3d8 = (FabArrayBase *)local_7e8._8_8_;
          uStack_3e8 = (double *)
                       ((dVar98 * dVar98 + dVar100 * dVar100 + dVar3 * dVar3) * -0.1111111111111111)
          ;
          LoopConcurrent<amrex::mlndlap_jacobi_aa(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<int_const>const&,amrex::GpuArray<double,3u>const&)::_lambda(int,int,int)_1_>
                    ((Box *)&local_ad8,(anon_class_328_6_f7bd19c5 *)local_4e8);
          MFIter::operator++((MFIter *)local_6e8);
        } while (local_6c8 < iStack_6c0);
      }
    }
    else {
      MFIter::MFIter((MFIter *)local_6e8,(FabArrayBase *)sol,true);
      if (local_6c8 < iStack_6c0) {
        do {
          MFIter::tilebox((Box *)&local_928,(MFIter *)local_6e8);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((Array4<const_double> *)local_7e8,(FabArray<amrex::FArrayBox> *)*plVar90,
                     (MFIter *)local_6e8);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((Array4<const_double> *)local_5e8,(FabArray<amrex::FArrayBox> *)plVar90[1],
                     (MFIter *)local_6e8);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((Array4<const_double> *)local_308,(FabArray<amrex::FArrayBox> *)plVar90[2],
                     (MFIter *)local_6e8);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<double> *)local_8e8,&sol->super_FabArray<amrex::FArrayBox>,
                     (MFIter *)local_6e8);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_a48,(FabArray<amrex::FArrayBox> *)local_1b0,(MFIter *)local_6e8);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_ad8,&rhs->super_FabArray<amrex::FArrayBox>,(MFIter *)local_6e8);
          FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                    ((Array4<const_int> *)&local_968,this_00,(MFIter *)local_6e8);
          local_4e8._16_8_ = CONCAT44(local_968.kstride._4_4_,(int)local_968.kstride);
          pFStack_4d0 = (FabArrayBase *)
                        CONCAT44(local_968.nstride._4_4_,(undefined4)local_968.nstride);
          local_4c8 = (FabArrayBase *)CONCAT44(local_968.begin.y,local_968.begin.x);
          uStack_4b4 = local_968._52_8_;
          local_4e8._0_8_ = local_968.p;
          local_4e8._8_8_ = local_968.jstride;
          pFStack_488 = (FabArrayBase *)CONCAT44(iStack_8c4,local_8c8);
          uStack_474._4_4_ = local_8b0;
          uStack_474._0_4_ = iStack_8b4;
          local_498 = (FabArrayBase *)local_8e8._16_8_;
          pFStack_490 = pFStack_8d0;
          local_4a8.super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
               (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)
               (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)local_8e8._0_8_;
          pFStack_4a0 = (FabArrayBase *)local_8e8._8_8_;
          pFStack_448 = (FabArrayBase *)CONCAT44(local_ad8.begin.y,local_ad8.begin.x);
          uStack_438._4_4_ = local_ad8.end.z;
          uStack_430 = local_ad8.ncomp;
          local_458 = (FabArrayBase *)local_ad8.kstride;
          pFStack_450 = (FabArrayBase *)local_ad8.nstride;
          local_468.super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
               (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)
               (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)local_ad8.p;
          tStack_460.
          super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
          super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
               (_Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>)
               (_Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>)
               local_ad8.jstride;
          iStack_3f4 = local_a48.end.z;
          iStack_3f0 = local_a48.ncomp;
          local_408 = local_a48.begin.x;
          iStack_404 = local_a48.begin.y;
          local_418 = (FabArrayBase *)local_a48.kstride;
          pFStack_410 = (FabArrayBase *)local_a48.nstride;
          local_428 = (int)local_a48.p;
          uStack_424 = (undefined4)((ulong)local_a48.p >> 0x20);
          pFStack_420 = (FabArrayBase *)local_a48.jstride;
          iStack_3b0 = iStack_7b8;
          iStack_3ac = (int)uStack_7b4;
          iStack_3a8 = SUB84(uStack_7b4,4);
          local_3c0 = (int)local_7e8._32_8_;
          iStack_3bc = SUB84(local_7e8._32_8_,4);
          iStack_3b4 = iStack_7bc;
          pFStack_3d0 = (FabArrayBase *)local_7e8._16_8_;
          iStack_3c8 = (int)local_7e8._24_8_;
          iStack_3c4 = SUB84(local_7e8._24_8_,4);
          iStack_3e0 = (int)local_7e8._0_8_;
          uStack_3dc = SUB84(local_7e8._0_8_,4);
          local_3d8 = (FabArrayBase *)local_7e8._8_8_;
          local_364 = (int)uStack_5b4;
          iStack_360 = SUB84(uStack_5b4,4);
          pFStack_378 = (FabArrayBase *)local_5e8._32_8_;
          pFStack_388 = (FabArrayBase *)local_5e8._16_8_;
          local_380 = (FabArrayBase *)local_5e8._24_8_;
          iStack_398 = (int)local_5e8._0_8_;
          uStack_394 = SUB84(local_5e8._0_8_,4);
          local_390 = (FabArrayBase *)local_5e8._8_8_;
          uStack_31c = local_308._52_8_;
          pFStack_330 = (FabArrayBase *)local_308._32_8_;
          local_340 = (FabArrayBase *)local_308._16_8_;
          pFStack_338 = (FabArrayBase *)local_308._24_8_;
          local_350 = (FabArrayBase *)local_308._0_8_;
          pFStack_348 = (FabArrayBase *)local_308._8_8_;
          uStack_3e8 = (double *)(dVar100 * -0.1111111111111111 * dVar100);
          uStack_3a0 = dVar3 * -0.1111111111111111 * dVar3;
          dStack_358 = dVar98 * -0.1111111111111111 * dVar98;
          LoopConcurrent<amrex::mlndlap_jacobi_ha(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<int_const>const&,amrex::GpuArray<double,3u>const&)::_lambda(int,int,int)_1_>
                    ((Box *)&local_928,(anon_class_472_10_2a1b4a53 *)local_4e8);
          MFIter::operator++((MFIter *)local_6e8);
        } while (local_6c8 < iStack_6c0);
      }
    }
    MFIter::~MFIter((MFIter *)local_6e8);
    MultiFab::~MultiFab((MultiFab *)local_1b0);
    return;
  }
  if ((this->super_MLNodeLinOp).m_coarsening_strategy == RAP) {
    MFIter::MFIter((MFIter *)local_1b0,(FabArrayBase *)sol,'\0');
    if ((int)local_1a8[3]._0_4_ < (int)local_1a8[4]._0_4_) {
      do {
        BATransformer::operator()
                  ((Box *)local_8e8,&(local_1a8[0]->boxarray).m_bat,
                   (Box *)((long)*(int *)(*(long *)local_1a8[6] + (long)(int)local_1a8[3]._0_4_ * 4)
                           * 0x1c + *(long *)&(((local_1a8[0]->boxarray).m_ref.
                                                super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_ptr)->m_abox).
                                              super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                              ._M_impl.super__Vector_impl_data));
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)local_6e8,&sol->super_FabArray<amrex::FArrayBox>,
                   (MFIter *)local_1b0);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((Array4<const_double> *)local_7e8,&rhs->super_FabArray<amrex::FArrayBox>,
                   (MFIter *)local_1b0);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((Array4<const_double> *)local_5e8,
                   *(FabArray<amrex::FArrayBox> **)(lVar76 + lVar85 * 8),(MFIter *)local_1b0);
        FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                  ((Array4<const_int> *)local_308,this_00,(MFIter *)local_1b0);
        if (0 < (this->super_MLNodeLinOp).m_smooth_num_sweeps) {
          iVar87 = 0;
          do {
            uStack_4b4 = local_308._52_8_;
            local_4c8 = (FabArrayBase *)local_308._32_8_;
            local_4e8._16_8_ = local_308._16_8_;
            pFStack_4d0 = (FabArrayBase *)local_308._24_8_;
            local_4e8._0_8_ = local_308._0_8_;
            local_4e8._8_8_ = local_308._8_8_;
            pFStack_488 = (FabArrayBase *)CONCAT44(iStack_6c4,local_6c8);
            uStack_474 = uStack_6b4;
            local_498 = (FabArrayBase *)local_6e8._16_8_;
            pFStack_490 = pFStack_6d0;
            local_4a8.super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
                 (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)
                 (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)local_6e8._0_8_;
            pFStack_4a0 = (FabArrayBase *)local_6e8._8_8_;
            uStack_438._0_4_ = iStack_5b8;
            uStack_438._4_4_ = (int)uStack_5b4;
            uStack_430 = SUB84(uStack_5b4,4);
            pFStack_448 = (FabArrayBase *)local_5e8._32_8_;
            uStack_440._0_4_ = iStack_5c0;
            uStack_440._4_4_ = iStack_5bc;
            local_458 = (FabArrayBase *)local_5e8._16_8_;
            pFStack_450 = (FabArrayBase *)local_5e8._24_8_;
            local_468.super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
                 (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)
                 (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)local_5e8._0_8_;
            tStack_460.
            super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
            .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
                 (_Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                 )(_Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                   )local_5e8._8_8_;
            iStack_3f8 = iStack_7b8;
            iStack_3f4 = (int)uStack_7b4;
            iStack_3f0 = SUB84(uStack_7b4,4);
            local_408 = (int)local_7e8._32_8_;
            iStack_404 = SUB84(local_7e8._32_8_,4);
            iStack_400 = iStack_7c0;
            iStack_3fc = iStack_7bc;
            local_418 = (FabArrayBase *)local_7e8._16_8_;
            pFStack_410 = (FabArrayBase *)local_7e8._24_8_;
            local_428 = (int)local_7e8._0_8_;
            uStack_424 = SUB84(local_7e8._0_8_,4);
            pFStack_420 = (FabArrayBase *)local_7e8._8_8_;
            LoopConcurrent<amrex::mlndlap_gauss_seidel_sten(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<int_const>const&)::_lambda(int,int,int)_1_>
                      ((Box *)local_8e8,(anon_class_256_4_a2b17762 *)local_4e8);
            iVar87 = iVar87 + 1;
          } while (iVar87 < (this->super_MLNodeLinOp).m_smooth_num_sweeps);
        }
        MFIter::operator++((MFIter *)local_1b0);
      } while ((int)local_1a8[3]._0_4_ < (int)local_1a8[4]._0_4_);
    }
    MFIter::~MFIter((MFIter *)local_1b0);
  }
  else {
    if (*plVar90 == 0) {
      RVar2 = this->m_const_sigma;
      MFIter::MFIter((MFIter *)local_1b0,(FabArrayBase *)sol,'\0');
      if ((int)local_1a8[3]._0_4_ < (int)local_1a8[4]._0_4_) {
        dVar98 = dVar98 * 0.027777777777777776 * dVar98;
        dVar100 = dVar100 * 0.027777777777777776 * dVar100;
        dVar3 = dVar3 * 0.027777777777777776 * dVar3;
        dVar46 = dVar98 + dVar98;
        dVar48 = dVar3 + dVar3;
        do {
          BATransformer::operator()
                    ((Box *)local_308,&(local_1a8[0]->boxarray).m_bat,
                     (Box *)((long)*(int *)(*(long *)local_1a8[6] +
                                           (long)(int)local_1a8[3]._0_4_ * 4) * 0x1c +
                            *(long *)&(((local_1a8[0]->boxarray).m_ref.
                                        super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->m_abox).
                                      super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                      _M_impl.super__Vector_impl_data));
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<double> *)local_6e8,&sol->super_FabArray<amrex::FArrayBox>,
                     (MFIter *)local_1b0);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((Array4<const_double> *)local_7e8,&rhs->super_FabArray<amrex::FArrayBox>,
                     (MFIter *)local_1b0);
          FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                    ((Array4<const_int> *)local_5e8,this_00,(MFIter *)local_1b0);
          if (0 < (this->super_MLNodeLinOp).m_smooth_num_sweeps) {
            iVar87 = 0;
            do {
              uStack_4b4 = uStack_5b4;
              local_4c8 = (FabArrayBase *)local_5e8._32_8_;
              local_4e8._16_8_ = local_5e8._16_8_;
              pFStack_4d0 = (FabArrayBase *)local_5e8._24_8_;
              local_4e8._0_8_ = local_5e8._0_8_;
              local_4e8._8_8_ = local_5e8._8_8_;
              pFStack_488 = (FabArrayBase *)CONCAT44(iStack_6c4,local_6c8);
              uStack_474 = uStack_6b4;
              local_498 = (FabArrayBase *)local_6e8._16_8_;
              pFStack_490 = pFStack_6d0;
              local_4a8.super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
                   (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)
                   (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)local_6e8._0_8_;
              pFStack_4a0 = (FabArrayBase *)local_6e8._8_8_;
              iStack_400 = iStack_7b8;
              iStack_3fc = (int)uStack_7b4;
              iStack_3f8 = SUB84(uStack_7b4,4);
              pFStack_410 = (FabArrayBase *)local_7e8._32_8_;
              local_408 = iStack_7c0;
              iStack_404 = iStack_7bc;
              pFStack_420 = (FabArrayBase *)local_7e8._16_8_;
              local_418 = (FabArrayBase *)local_7e8._24_8_;
              uStack_430 = (uint)local_7e8._0_8_;
              iStack_42c = SUB84(local_7e8._0_8_,4);
              local_428 = (int)local_7e8._8_8_;
              uStack_424 = SUB84(local_7e8._8_8_,4);
              iStack_3f0 = SUB84(RVar2,0);
              iStack_3ec = (int)((ulong)RVar2 >> 0x20);
              local_468.super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
                   (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)
                   (FabArrayBase *)(dVar100 + dVar3 + dVar98);
              tStack_460.
              super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
              .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
                   (_Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                    )(_Head_base<0UL,_amrex::FabArrayBase_*,_false>)
                     (((dVar3 + dVar3) - dVar100) + dVar46);
              local_458 = (FabArrayBase *)(((dVar100 + dVar100) - dVar3) + dVar46);
              pFStack_450 = (FabArrayBase *)((dVar100 + dVar100 + dVar48) - dVar98);
              pFStack_448 = (FabArrayBase *)((dVar100 * 4.0 + -dVar48) - dVar46);
              uStack_440 = (dVar100 * -2.0 + dVar3 * 4.0) - dVar46;
              uStack_438 = dVar98 * 4.0 + (dVar100 * -2.0 - dVar48);
              Loop<amrex::mlndlap_gauss_seidel_c(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,double,amrex::Array4<int_const>const&,amrex::GpuArray<double,3u>const&)::_lambda(int,int,int)_1_>
                        ((Box *)local_308,(anon_class_256_11_43b85e95 *)local_4e8);
              iVar87 = iVar87 + 1;
            } while (iVar87 < (this->super_MLNodeLinOp).m_smooth_num_sweeps);
          }
          MFIter::operator++((MFIter *)local_1b0);
        } while ((int)local_1a8[3]._0_4_ < (int)local_1a8[4]._0_4_);
      }
    }
    else {
      if (((local_a54 < 1) || (this->m_use_harmonic_average == false)) &&
         (this->m_use_mapped != true)) {
        MFIter::MFIter((MFIter *)local_8e8,(FabArrayBase *)sol,'\0');
        if (local_8c8 < iStack_8c0) {
          dVar101 = dVar100 * 0.027777777777777776 * dVar100;
          dVar99 = dVar3 * 0.027777777777777776 * dVar3;
          dVar46 = dVar98 * 0.027777777777777776 * dVar98;
          local_828 = dVar101 + dVar99 + dVar46;
          dVar48 = dVar99 + dVar99;
          local_848._8_4_ = SUB84(dVar3,0);
          local_848._0_8_ = (dVar101 + dVar101 + dVar48) - dVar46;
          local_848._12_4_ = (int)((ulong)dVar3 >> 0x20);
          local_868 = (dVar101 * 4.0 - dVar48) + dVar46 * -2.0;
          local_818 = dVar99 * 4.0 + dVar101 * -2.0 + dVar46 * -2.0;
          local_7f0 = (double)-(ulong)(dVar98 < dVar100 || dVar98 < dVar3);
          local_974 = -(uint)(dVar3 < dVar98 || dVar3 < dVar100);
          local_978 = -(uint)(dVar100 < dVar98 || dVar100 < dVar3);
          dVar100 = dVar100 * 0.027777777777777776 * dVar100;
          dStack_1d0 = dVar3 * 0.027777777777777776 * dVar3;
          local_1d8 = (FabArrayBase *)(dVar100 + dStack_1d0 + dVar46);
          dVar98 = dStack_1d0 + dStack_1d0;
          local_208._8_4_ = SUB84(dStack_1d0,0);
          local_208._0_8_ = (dVar100 + dVar100 + dVar98) - dVar46;
          local_208._12_4_ = (int)((ulong)dStack_1d0 >> 0x20);
          dStack_1f0 = dVar46 + dVar46;
          local_838 = (dVar48 - dVar101) + dStack_1f0;
          local_858 = ((dVar101 + dVar101) - dVar99) + dStack_1f0;
          pFStack_1e0 = (FabArrayBase *)(((dVar100 + dVar100) - dStack_1d0) + dStack_1f0);
          local_1e8 = (FabArrayBase *)(((dStack_1d0 + dStack_1d0) - dVar100) + dStack_1f0);
          local_1f8 = (dVar100 * 4.0 + -dVar98) - dStack_1f0;
          dStack_1f0 = (dVar100 * -2.0 + dStack_1d0 * 4.0) - dStack_1f0;
          local_808 = (dVar101 * -2.0 - dVar48) + dVar46 * 4.0;
          local_97c = 1;
          if ((local_974 & 1) != 0) {
            local_97c = SUB84(local_7f0,0) | 2;
          }
          if ((local_978 & 1) == 0) {
            local_97c = 0;
          }
          local_988 = local_828 * -4.0;
          local_1c8 = (dVar100 * -2.0 - dVar98) + dVar46 * 4.0;
          dStack_860 = dVar3;
          dStack_850 = dVar3;
          dStack_830 = dVar3;
          dStack_820 = dVar3;
          dStack_810 = dVar3;
          dStack_800 = dVar3;
          dStack_1c0 = dStack_1d0;
          do {
            BATransformer::operator()
                      (&local_884,(BATransformer *)(local_8e8._8_8_ + 8),
                       (Box *)((long)*(int *)(*(long *)CONCAT44(uStack_8ac,local_8b0) +
                                             (long)local_8c8 * 4) * 0x1c +
                              *(long *)&(((((BoxArray *)(local_8e8._8_8_ + 8))->m_ref).
                                          super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->m_abox).
                                        super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                        _M_impl));
            FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (&local_a48,(FabArray<amrex::FArrayBox> *)*plVar90,(MFIter *)local_8e8);
            FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      ((Array4<double> *)&local_ad8,&sol->super_FabArray<amrex::FArrayBox>,
                       (MFIter *)local_8e8);
            FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (&local_968,&rhs->super_FabArray<amrex::FArrayBox>,(MFIter *)local_8e8);
            FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                      (&local_928,this_00,(MFIter *)local_8e8);
            if (bVar96) {
              if (0 < (this->super_MLNodeLinOp).m_smooth_num_sweeps) {
                iVar87 = 0;
                do {
                  local_4c8 = (FabArrayBase *)CONCAT44(local_928.begin.y,local_928.begin.x);
                  uStack_4b4 = local_928._52_8_;
                  local_4e8._16_8_ = local_928.kstride;
                  pFStack_4d0 = (FabArrayBase *)local_928.nstride;
                  local_4e8._0_8_ = local_928.p;
                  local_4e8._8_8_ = local_928.jstride;
                  pFStack_488 = (FabArrayBase *)CONCAT44(local_ad8.begin.y,local_ad8.begin.x);
                  uStack_474 = local_ad8._52_8_;
                  local_498 = (FabArrayBase *)local_ad8.kstride;
                  pFStack_490 = (FabArrayBase *)local_ad8.nstride;
                  local_4a8.super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
                       (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)
                       (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)local_ad8.p;
                  pFStack_4a0 = (FabArrayBase *)local_ad8.jstride;
                  local_468.super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
                       (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)
                       (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)local_1d8;
                  uStack_430 = local_a48.end.y;
                  iStack_42c = local_a48.end.z;
                  local_428 = local_a48.ncomp;
                  uStack_440._0_4_ = local_a48.begin.x;
                  uStack_440._4_4_ = local_a48.begin.y;
                  uStack_438._0_4_ = local_a48.begin.z;
                  uStack_438._4_4_ = local_a48.end.x;
                  pFStack_450 = (FabArrayBase *)local_a48.kstride;
                  pFStack_448 = (FabArrayBase *)local_a48.nstride;
                  tStack_460.
                  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                  .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
                       (_Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                        )(_Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                          )local_a48.p;
                  local_458 = (FabArrayBase *)local_a48.jstride;
                  pFStack_420 = local_1e8;
                  local_418 = pFStack_1e0;
                  pFStack_410 = (FabArrayBase *)local_208._0_8_;
                  local_408 = SUB84(local_1f8,0);
                  iStack_404 = (int)((ulong)local_1f8 >> 0x20);
                  iStack_400 = SUB84(dStack_1f0,0);
                  iStack_3fc = (int)((ulong)dStack_1f0 >> 0x20);
                  iStack_3f8 = SUB84(local_1c8,0);
                  iStack_3f4 = (int)((ulong)local_1c8 >> 0x20);
                  pFStack_3d0 = (FabArrayBase *)CONCAT44(local_968.begin.y,local_968.begin.x);
                  local_3c0 = local_968.end.y;
                  iStack_3bc = local_968.end.z;
                  iStack_3b8 = local_968.ncomp;
                  iStack_3c8 = local_968.begin.z;
                  iStack_3c4 = local_968.end.x;
                  iStack_3e0 = (int)local_968.kstride;
                  uStack_3dc = local_968.kstride._4_4_;
                  local_3d8 = (FabArrayBase *)
                              CONCAT44(local_968.nstride._4_4_,(undefined4)local_968.nstride);
                  iStack_3f0 = (int)local_968.p;
                  iStack_3ec = (int)((ulong)local_968.p >> 0x20);
                  uStack_3e8._0_4_ = (int)local_968.jstride;
                  uStack_3e8._4_4_ = (int)((ulong)local_968.jstride >> 0x20);
                  Loop<amrex::mlndlap_gauss_seidel_aa(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<int_const>const&,amrex::GpuArray<double,3u>const&)::_lambda(int,int,int)_1_>
                            (&local_884,(anon_class_312_11_b8f6ed96 *)local_4e8);
                  iVar87 = iVar87 + 1;
                } while (iVar87 < (this->super_MLNodeLinOp).m_smooth_num_sweeps);
              }
            }
            else if (0 < (this->super_MLNodeLinOp).m_smooth_num_sweeps) {
              local_a50 = 0;
              do {
                iVar55 = local_884.bigend.vect[2];
                iVar54 = local_884.bigend.vect[1];
                iVar53 = local_884.bigend.vect[0];
                iVar87 = local_884.smallend.vect[2];
                local_bd0 = local_884.smallend.vect[1];
                iVar52 = local_884.smallend.vect[0];
                uVar64 = (ulong)(uint)local_884.smallend.vect[0];
                uVar70 = (local_884.bigend.vect[2] - local_884.smallend.vect[2]) + 1;
                uVar50 = uVar70;
                if (((ulong)local_7f0 & 1) != 0) {
                  uVar50 = 0x21;
                }
                uVar73 = (local_884.bigend.vect[1] - local_884.smallend.vect[1]) + 1;
                if ((local_974 & 1) == 0) {
                  uVar50 = uVar73;
                }
                uVar92 = local_884.bigend.vect[0] - local_884.smallend.vect[0];
                uVar58 = uVar92 + 1;
                auVar51._8_8_ = 0;
                auVar51._0_8_ = local_c68._8_8_;
                local_c68 = auVar51 << 0x40;
                if ((local_978 & 1) == 0) {
                  uVar50 = uVar58;
                }
                uVar75 = (ulong)uVar50;
                if (0x20 < (int)uVar50) {
                  Abort_host(
                            "mlndlap_gauss_seidel_with_line_solve_aa is hard-wired to be no longer than 32"
                            );
                }
                if (local_97c == 2) {
                  if (local_bd0 <= iVar54) {
                    lVar67 = (long)iVar87;
                    local_9e0 = (ulong)(uVar50 - 2);
                    local_9d8 = CONCAT44(local_9d8._4_4_,iVar87 + 1);
                    local_a08 = lVar67 + -1;
                    local_96c = iVar52 - 1;
                    local_a4c = local_bd0 + -1;
                    local_970 = iVar52 + 1;
                    local_9c0 = uVar75 * 8 + -8;
                    local_9e8 = local_9e0 + 1;
                    iVar63 = local_bd0;
                    do {
                      local_bd0 = local_bd0 + 1;
                      lVar85 = (long)iVar63;
                      if (iVar52 <= iVar53) {
                        local_9c8 = (long)local_a4c;
                        local_9d0 = CONCAT44(local_9d0._4_4_,iVar63 + -1);
                        local_a00 = CONCAT44(local_a00._4_4_,local_970);
                        local_bfc = local_96c;
                        uVar75 = uVar64;
                        do {
                          lVar76 = local_9c0;
                          lVar60 = (long)(int)uVar75;
                          local_a98 = lVar60 * 8;
                          if (iVar87 <= iVar55) {
                            lVar88 = (long)local_ad8.begin.x;
                            iVar80 = (int)uVar75 - local_ad8.begin.x;
                            lVar61 = (long)(iVar80 + -1);
                            lVar72 = ((int)local_9d0 - local_ad8.begin.y) * local_ad8.jstride;
                            local_a88 = (_Alloc_hider *)local_ad8.p + lVar72 + lVar61;
                            lVar65 = (long)(iVar80 + 1);
                            local_a90 = (_Alloc_hider *)local_ad8.p + lVar72 + lVar65;
                            lVar74 = ((iVar63 + 1) - local_ad8.begin.y) * local_ad8.jstride;
                            local_990 = (_Alloc_hider *)local_ad8.p + lVar74 + lVar61;
                            local_998 = (_Alloc_hider *)local_ad8.p + lVar74 + lVar65;
                            local_9a0 = (_Alloc_hider *)local_ad8.p + lVar72 + iVar80;
                            local_9a8 = (_Alloc_hider *)local_ad8.p + lVar74 + iVar80;
                            lVar62 = (iVar63 - local_ad8.begin.y) * local_ad8.jstride;
                            local_9b0 = (FabArrayBase *)
                                        ((_Alloc_hider *)local_ad8.p + lVar62 + lVar61);
                            lVar83 = (lVar85 - local_a48.begin.y) * local_a48.jstride * 8;
                            lVar91 = (local_9c8 - local_a48.begin.y) * local_a48.jstride * 8;
                            lVar74 = (lVar85 - local_ad8.begin.y) * local_ad8.jstride;
                            lVar82 = (local_bd0 - local_ad8.begin.y) * local_ad8.jstride;
                            lVar79 = (local_9c8 - local_ad8.begin.y) * local_ad8.jstride;
                            local_9f0 = (ulong)(uint)((int)local_9d8 - local_ad8.begin.z);
                            lVar68 = (local_a08 - local_ad8.begin.z) * local_ad8.kstride;
                            lVar61 = lVar68 + lVar74;
                            lVar72 = lVar68 + lVar82;
                            lVar68 = lVar68 + lVar79;
                            lVar71 = (lVar67 - local_ad8.begin.z) * local_ad8.kstride;
                            lVar82 = lVar82 + lVar71;
                            lVar79 = lVar79 + lVar71;
                            lVar71 = lVar71 + lVar74;
                            lVar86 = (long)((int)local_a00 - local_ad8.begin.x);
                            lVar89 = (long)local_bfc;
                            local_bd8 = lVar61 + lVar86;
                            lVar95 = (lVar61 + lVar89) - lVar88;
                            lVar93 = (lVar60 + lVar72) - lVar88;
                            local_be0 = (lVar60 + lVar68) - lVar88;
                            lVar61 = lVar86 + lVar72;
                            local_ba8 = (lVar72 + lVar89) - lVar88;
                            local_bb0 = lVar68 + lVar86;
                            local_c08 = (lVar60 + lVar82) - lVar88;
                            lVar74 = (lVar60 + lVar79) - lVar88;
                            local_c68._0_8_ = lVar74;
                            local_b50 = lVar71 + lVar86;
                            lVar77 = (lVar71 + lVar89) - lVar88;
                            local_c10 = lVar82 + lVar86;
                            lVar82 = (lVar82 + lVar89) - lVar88;
                            local_ae8 = lVar86 + lVar79;
                            lVar86 = (lVar79 + lVar89) - lVar88;
                            local_a70 = CONCAT44(local_968.kstride._4_4_,(int)local_968.kstride) * 8
                            ;
                            local_a78 = (double)(local_a48.kstride * 8);
                            local_b90 = (local_a08 - local_a48.begin.z) * (long)local_a78;
                            local_b60 = lVar83 + local_b90;
                            local_b90 = local_b90 + lVar91;
                            lVar71 = (lVar67 - local_a48.begin.z) * (long)local_a78;
                            lVar83 = lVar83 + lVar71;
                            lVar71 = lVar71 + lVar91;
                            local_bb8 = (long)&((_Alloc_hider *)local_a48.p)[lVar60]._M_p +
                                        local_b60;
                            local_b60 = (long)&((_Alloc_hider *)local_a48.p)[lVar89]._M_p +
                                        local_b60;
                            local_b68 = (long)&((_Alloc_hider *)local_a48.p)[lVar60]._M_p +
                                        local_b90;
                            local_b90 = (long)&((_Alloc_hider *)local_a48.p)[lVar89]._M_p +
                                        local_b90;
                            lVar72 = (long)&((_Alloc_hider *)local_a48.p)[lVar60]._M_p + lVar83;
                            local_ba0 = (long)&((_Alloc_hider *)local_a48.p)[lVar89]._M_p + lVar83;
                            lVar91 = (long)&((_Alloc_hider *)local_a48.p)[lVar60]._M_p + lVar71;
                            lVar71 = (long)&((_Alloc_hider *)local_a48.p)[lVar89]._M_p + lVar71;
                            local_a80 = (double)(local_928.kstride * 4);
                            local_9b8 = (long)local_a48.begin.x * -8;
                            local_bf8 = (double *)
                                        ((lVar67 - local_968.begin.z) * local_a70 +
                                         (lVar85 - local_968.begin.y) * local_968.jstride * 8 +
                                         local_a98 + (long)local_968.begin.x * -8 +
                                        (long)local_968.p);
                            lVar83 = 0;
                            p_Var56 = (_Alloc_hider *)((lVar68 + lVar89) - lVar88);
                            p_Var57 = (_Alloc_hider *)
                                      ((lVar85 - local_928.begin.y) * local_928.jstride * 4 +
                                       (lVar67 - local_928.begin.z) * (long)local_a80 + lVar60 * 4 +
                                       (long)local_928.begin.x * -4 + (long)local_928.p);
                            local_b58 = lVar67;
                            do {
                              local_a60 = p_Var57;
                              local_a68 = p_Var56;
                              local_c68._0_8_ = lVar74;
                              if (*(int *)&local_a60->_M_p == 0) {
                                dVar98 = *(double *)(local_b90 + local_9b8);
                                dVar100 = *(double *)(local_b68 + local_9b8);
                                dVar5 = dVar98 + dVar100;
                                dVar3 = *(double *)(local_b60 + local_9b8);
                                dVar46 = *(double *)(local_bb8 + local_9b8);
                                dVar6 = dVar5 + dVar3 + dVar46;
                                dVar48 = *(double *)(lVar71 + local_9b8);
                                dVar99 = *(double *)(lVar91 + local_9b8);
                                dVar101 = *(double *)(local_ba0 + local_9b8);
                                dVar103 = *(double *)(lVar72 + local_9b8);
                                pp_Var4 = (_func_int **)
                                          ((_Alloc_hider *)local_ad8.p)[local_bb0]._M_p;
                                pp_Var7 = (_func_int **)
                                          ((_Alloc_hider *)local_ad8.p)[(long)local_a68]._M_p;
                                pp_Var9 = (_func_int **)
                                          ((_Alloc_hider *)local_ad8.p)[local_ba8]._M_p;
                                pp_Var11 = (_func_int **)((_Alloc_hider *)local_ad8.p)[lVar61]._M_p;
                                lVar60 = (((int)local_9d8 - local_ad8.begin.z) + (int)lVar83) *
                                         local_ad8.kstride;
                                pp_Var17 = (_func_int **)local_a88[lVar60]._M_p;
                                pp_Var19 = (_func_int **)local_a90[lVar60]._M_p;
                                pp_Var20 = (_func_int **)local_990[lVar60]._M_p;
                                pp_Var23 = (_func_int **)local_998[lVar60]._M_p;
                                pp_Var28 = (_func_int **)((_Alloc_hider *)local_ad8.p)[lVar93]._M_p;
                                pp_Var29 = (_func_int **)
                                           ((_Alloc_hider *)local_ad8.p)[local_be0]._M_p;
                                pp_Var30 = (_func_int **)local_9a0[lVar60]._M_p;
                                pp_Var31 = (_func_int **)((_Alloc_hider *)local_ad8.p)[lVar95]._M_p;
                                pp_Var32 = (_func_int **)local_9a8[lVar60]._M_p;
                                pp_Var33 = (_func_int **)
                                           ((_Alloc_hider *)local_ad8.p)[local_bd8]._M_p;
                                pp_Var34 = (_func_int **)
                                           ((_Alloc_hider *)&local_9b0->_vptr_FabArrayBase)[lVar60].
                                           _M_p;
                                pp_Var35 = (_func_int **)
                                           ((_Alloc_hider *)local_ad8.p)[lVar62 + lVar65 + lVar60].
                                           _M_p;
                                pp_Var36 = (_func_int **)
                                           ((_Alloc_hider *)local_ad8.p)[local_ae8]._M_p;
                                pp_Var37 = (_func_int **)((_Alloc_hider *)local_ad8.p)[lVar86]._M_p;
                                pp_Var38 = (_func_int **)((_Alloc_hider *)local_ad8.p)[lVar82]._M_p;
                                pp_Var39 = (_func_int **)
                                           ((_Alloc_hider *)local_ad8.p)[local_c10]._M_p;
                                pp_Var40 = (_func_int **)
                                           ((_Alloc_hider *)local_ad8.p)[local_b50]._M_p;
                                pp_Var41 = (_func_int **)((_Alloc_hider *)local_ad8.p)[lVar77]._M_p;
                                pp_Var42 = (_func_int **)
                                           ((_Alloc_hider *)local_ad8.p)[local_c08]._M_p;
                                pp_Var43 = (_func_int **)((_Alloc_hider *)local_ad8.p)[lVar74]._M_p;
                                *(double *)(local_4e8 + lVar83 * 8) = dVar6 * local_808;
                                local_1a8[lVar83 + -1] =
                                     (FabArrayBase *)
                                     ((dVar6 + dVar48 + dVar99 + dVar101 + dVar103) * local_988);
                                *(double *)(local_6e8 + lVar83 * 8) =
                                     (dVar48 + dVar99 + dVar101 + dVar103) * local_808;
                                *(undefined8 *)(local_7e8 + lVar83 * 8) = 0;
                                dVar98 = *local_bf8 -
                                         (((dVar5 + dVar48 + dVar99) * (double)pp_Var43 +
                                          (dVar3 + dVar46 + dVar101 + dVar103) * (double)pp_Var42) *
                                          local_818 +
                                         ((dVar98 + dVar3 + dVar48 + dVar101) * (double)pp_Var41 +
                                         (dVar100 + dVar46 + dVar99 + dVar103) * (double)pp_Var40) *
                                         local_868 +
                                         ((dVar46 + dVar103) * (double)pp_Var39 +
                                         (dVar3 + dVar101) * (double)pp_Var38 +
                                         (dVar98 + dVar48) * (double)pp_Var37 +
                                         (dVar100 + dVar99) * (double)pp_Var36) *
                                         (double)local_848._0_8_ +
                                         ((dVar99 + dVar103) * (double)pp_Var35 +
                                         (dVar48 + dVar101) * (double)pp_Var34 +
                                         (double)pp_Var31 * (dVar98 + dVar3) +
                                         (double)pp_Var33 * (dVar100 + dVar46)) * local_858 +
                                         ((double)pp_Var23 * dVar103 +
                                         (double)pp_Var20 * dVar101 +
                                         (double)pp_Var19 * dVar99 +
                                         (double)pp_Var17 * dVar48 +
                                         (double)pp_Var11 * dVar46 +
                                         (double)pp_Var9 * dVar3 +
                                         (double)pp_Var7 * dVar98 + (double)pp_Var4 * dVar100) *
                                         local_828 +
                                         ((dVar101 + dVar103) * (double)pp_Var32 +
                                         (double)pp_Var30 * (dVar48 + dVar99) +
                                         (double)pp_Var29 * dVar5 +
                                         (double)pp_Var28 * (dVar3 + dVar46)) * local_838);
                                lVar60 = local_b58 - lVar67;
                              }
                              else {
                                *(undefined8 *)(local_4e8 + lVar83 * 8) = 0;
                                local_1a8[lVar83 + -1] = (FabArrayBase *)0x3ff0000000000000;
                                *(undefined8 *)(local_6e8 + lVar83 * 8) = 0;
                                *(undefined8 *)(local_7e8 + lVar83 * 8) = 0;
                                dVar98 = 0.0;
                                lVar60 = lVar83;
                              }
                              *(double *)(local_5e8 + lVar60 * 8) = dVar98;
                              local_b58 = local_b58 + 1;
                              lVar83 = lVar83 + 1;
                              local_bb8 = local_bb8 + (long)local_a78;
                              local_b60 = local_b60 + (long)local_a78;
                              local_b68 = local_b68 + (long)local_a78;
                              local_b90 = local_b90 + (long)local_a78;
                              local_bd8 = (long)&((_Alloc_hider *)local_ad8.kstride)->_M_p +
                                          local_bd8;
                              lVar95 = (long)&((_Alloc_hider *)local_ad8.kstride)->_M_p + lVar95;
                              lVar93 = (long)&((_Alloc_hider *)local_ad8.kstride)->_M_p + lVar93;
                              local_be0 = (long)&((_Alloc_hider *)local_ad8.kstride)->_M_p +
                                          local_be0;
                              lVar61 = (long)&((_Alloc_hider *)local_ad8.kstride)->_M_p + lVar61;
                              local_ba8 = (long)&((_Alloc_hider *)local_ad8.kstride)->_M_p +
                                          local_ba8;
                              local_bb0 = (long)&((_Alloc_hider *)local_ad8.kstride)->_M_p +
                                          local_bb0;
                              local_c08 = (long)&((_Alloc_hider *)local_ad8.kstride)->_M_p +
                                          local_c08;
                              lVar74 = (long)&((_Alloc_hider *)local_ad8.kstride)->_M_p + lVar74;
                              local_b50 = (long)&((_Alloc_hider *)local_ad8.kstride)->_M_p +
                                          local_b50;
                              lVar77 = (long)&((_Alloc_hider *)local_ad8.kstride)->_M_p + lVar77;
                              local_c10 = (long)&((_Alloc_hider *)local_ad8.kstride)->_M_p +
                                          local_c10;
                              lVar82 = (long)&((_Alloc_hider *)local_ad8.kstride)->_M_p + lVar82;
                              local_ae8 = (long)&((_Alloc_hider *)local_ad8.kstride)->_M_p +
                                          local_ae8;
                              lVar86 = (long)&((_Alloc_hider *)local_ad8.kstride)->_M_p + lVar86;
                              local_bf8 = local_bf8 +
                                          CONCAT44(local_968.kstride._4_4_,(int)local_968.kstride);
                              lVar72 = lVar72 + (long)local_a78;
                              local_ba0 = local_ba0 + (long)local_a78;
                              lVar91 = lVar91 + (long)local_a78;
                              lVar71 = lVar71 + (long)local_a78;
                              p_Var56 = (_Alloc_hider *)
                                        ((long)&((_Alloc_hider *)local_ad8.kstride)->_M_p +
                                        (long)&local_a68->_M_p);
                              p_Var57 = (_Alloc_hider *)((long)&local_a60->_M_p + (long)local_a80);
                            } while (uVar70 != (uint)lVar83);
                          }
                          local_7e8._0_8_ =
                               (FabArrayBase *)((double)local_5e8._0_8_ / (double)local_1b0);
                          local_9f8 = uVar75;
                          if (1 < (int)uVar50) {
                            lVar60 = 0;
                            auVar47 = local_1b0;
                            do {
                              dVar98 = *(double *)(local_6e8 + lVar60);
                              *(double *)(local_308 + lVar60 + 8) = dVar98 / (double)auVar47;
                              dVar100 = *(double *)(local_4e8 + lVar60 + 8);
                              auVar47 = (undefined1  [8])
                                        (*(double *)((long)local_1a8 + lVar60) -
                                        (dVar98 / (double)auVar47) * dVar100);
                              if (((double)auVar47 == 0.0) && (!NAN((double)auVar47))) {
                                Abort_host(">>>TRIDIAG FAILED");
                              }
                              *(double *)(local_7e8 + lVar60 + 8) =
                                   (-dVar100 * *(double *)(local_7e8 + lVar60) +
                                   *(double *)(local_5e8 + lVar60 + 8)) / (double)auVar47;
                              lVar60 = lVar60 + 8;
                            } while (lVar76 != lVar60);
                          }
                          if (1 < (int)uVar50) {
                            dVar98 = *(double *)(local_7e8 + local_9e0 * 8 + 8);
                            lVar76 = local_9e8;
                            do {
                              dVar98 = (&local_7f0)[lVar76] -
                                       dVar98 * *(double *)(local_308 + lVar76 * 8);
                              (&local_7f0)[lVar76] = dVar98;
                              lVar60 = lVar76 + -1;
                              bVar97 = 0 < lVar76;
                              lVar76 = lVar60;
                            } while (lVar60 != 0 && bVar97);
                          }
                          if (iVar87 <= iVar55) {
                            puVar66 = (undefined8 *)
                                      ((lVar67 - local_ad8.begin.z) * local_ad8.kstride * 8 +
                                       (lVar85 - local_ad8.begin.y) * local_ad8.jstride * 8 +
                                       local_a98 + (long)local_ad8.begin.x * -8 + (long)local_ad8.p)
                            ;
                            lVar76 = 0;
                            do {
                              *puVar66 = *(undefined8 *)(local_7e8 + lVar76 * 8);
                              lVar76 = lVar76 + 1;
                              puVar66 = puVar66 + local_ad8.kstride;
                            } while (uVar70 != (uint)lVar76);
                          }
                          uVar75 = (ulong)((int)local_9f8 + 1);
                          local_bfc = local_bfc + 1;
                          local_a00 = CONCAT44(local_a00._4_4_,(int)local_a00 + 1);
                        } while ((int)local_9f8 != iVar53);
                      }
                      local_a4c = local_a4c + 1;
                      bVar97 = iVar63 != iVar54;
                      iVar63 = iVar63 + 1;
                    } while (bVar97);
                  }
                }
                else if (local_97c == 1) {
                  if (iVar87 <= iVar55) {
                    lVar67 = (long)local_bd0;
                    local_9d0 = (ulong)(uVar50 - 2);
                    local_9c8 = CONCAT44(local_9c8._4_4_,local_bd0 + 1);
                    local_a08 = CONCAT44(local_a08._4_4_,iVar87 + -1);
                    local_9e0 = CONCAT44(local_9e0._4_4_,iVar52 - 1);
                    local_9e8 = CONCAT44(local_9e8._4_4_,iVar52 + 1);
                    local_a00 = uVar75 * 8 + -8;
                    local_9d8 = local_9d0 + 1;
                    local_bfc = iVar87;
                    do {
                      local_bfc = local_bfc + 1;
                      lVar85 = (long)iVar87;
                      if (iVar52 <= iVar53) {
                        local_9c0 = (long)(int)local_a08;
                        local_a98 = CONCAT44(local_a98._4_4_,(undefined4)local_9e8);
                        local_9f8 = CONCAT44(local_9f8._4_4_,(undefined4)local_9e0);
                        uVar75 = uVar64;
                        do {
                          lVar76 = local_a00;
                          lVar60 = (long)(int)uVar75;
                          local_9f0 = lVar60 * 8;
                          if (local_bd0 <= iVar54) {
                            lVar86 = (long)local_ad8.begin.x;
                            lVar95 = ((iVar87 + -1) - local_ad8.begin.z) * local_ad8.kstride;
                            lVar83 = ((iVar87 + 1) - local_ad8.begin.z) * local_ad8.kstride;
                            local_a88 = (_Alloc_hider *)
                                        ((iVar87 - local_ad8.begin.z) * local_ad8.kstride);
                            local_a90 = (_Alloc_hider *)
                                        (ulong)(uint)((int)local_9c8 - local_ad8.begin.y);
                            lVar93 = (lVar85 - local_a48.begin.z) * local_a48.kstride * 8;
                            lVar68 = (local_9c0 - local_a48.begin.z) * local_a48.kstride * 8;
                            lVar82 = ((lVar67 + -1) - (long)local_ad8.begin.y) * local_ad8.jstride;
                            lVar89 = (local_bfc - local_ad8.begin.z) * local_ad8.kstride;
                            lVar61 = lVar82 + lVar89;
                            lVar88 = (local_9c0 - local_ad8.begin.z) * local_ad8.kstride;
                            lVar74 = (lVar85 - local_ad8.begin.z) * local_ad8.kstride;
                            lVar72 = lVar82 + lVar88;
                            lVar82 = lVar82 + lVar74;
                            lVar91 = (lVar67 - local_ad8.begin.y) * local_ad8.jstride;
                            lVar89 = lVar89 + lVar91;
                            lVar88 = lVar88 + lVar91;
                            lVar91 = lVar91 + lVar74;
                            iVar63 = (int)uVar75 - local_ad8.begin.x;
                            local_b98 = (lVar60 + lVar61) - lVar86;
                            local_c28 = (long)((int)local_a98 - local_ad8.begin.x);
                            lVar62 = (long)(int)local_9f8;
                            local_b48 = lVar82 + local_c28;
                            local_c68._0_8_ = (lVar82 + lVar62) - lVar86;
                            lVar74 = lVar61 + local_c28;
                            local_b00 = (lVar61 + lVar62) - lVar86;
                            local_b08 = lVar72 + local_c28;
                            lVar77 = (lVar72 + lVar62) - lVar86;
                            local_ae8 = (lVar89 + lVar60) - lVar86;
                            lVar82 = (lVar60 + lVar88) - lVar86;
                            lVar61 = lVar91 + local_c28;
                            local_bd8 = lVar89 + local_c28;
                            local_c28 = local_c28 + lVar88;
                            lVar71 = (lVar91 + lVar62) - lVar86;
                            local_bb8 = (lVar89 + lVar62) - lVar86;
                            local_af8 = (lVar88 + lVar62) - lVar86;
                            lVar88 = local_a48.jstride * 8;
                            lVar65 = ((lVar67 + -1) - (long)local_a48.begin.y) * lVar88;
                            lVar91 = lVar65 + lVar93;
                            lVar65 = lVar65 + lVar68;
                            lVar89 = (lVar67 - local_a48.begin.y) * lVar88;
                            lVar93 = lVar93 + lVar89;
                            lVar89 = lVar89 + lVar68;
                            local_be0 = (long)&((_Alloc_hider *)local_a48.p)[lVar60]._M_p + lVar91;
                            local_ba8 = (long)&((_Alloc_hider *)local_a48.p)[lVar62]._M_p + lVar91;
                            local_c08 = (long)&((_Alloc_hider *)local_a48.p)[lVar60]._M_p + lVar65;
                            local_ba0 = (long)&((_Alloc_hider *)local_a48.p)[lVar62]._M_p + lVar65;
                            local_bb0 = (long)&((_Alloc_hider *)local_a48.p)[lVar60]._M_p + lVar93;
                            local_b60 = (long)&((_Alloc_hider *)local_a48.p)[lVar60]._M_p + lVar89;
                            lVar93 = (long)&((_Alloc_hider *)local_a48.p)[lVar62]._M_p + lVar93;
                            local_a70 = local_928.jstride * 4;
                            local_990 = (_Alloc_hider *)(long)(iVar63 + -1);
                            local_998 = (_Alloc_hider *)(long)(iVar63 + 1);
                            local_9a0 = (_Alloc_hider *)(long)iVar63;
                            pdVar94 = (double *)
                                      ((lVar67 - local_968.begin.y) * local_968.jstride * 8 +
                                       (lVar85 - local_968.begin.z) *
                                       CONCAT44(local_968.kstride._4_4_,(int)local_968.kstride) * 8
                                       + local_9f0 + (long)local_968.begin.x * -8 +
                                      (long)local_968.p);
                            piVar69 = (int *)((lVar67 - local_928.begin.y) * local_a70 +
                                              (lVar85 - local_928.begin.z) * local_928.kstride * 4 +
                                              lVar60 * 4 + (long)local_928.begin.x * -4 +
                                             (long)local_928.p);
                            local_9a8 = (_Alloc_hider *)((long)local_a48.begin.x * -8);
                            local_9b0 = (FabArrayBase *)local_ad8.p;
                            lVar91 = 0;
                            p_Var56 = (_Alloc_hider *)
                                      ((long)&((_Alloc_hider *)local_a48.p)[lVar62]._M_p + lVar89);
                            p_Var57 = (_Alloc_hider *)((lVar72 + lVar60) - lVar86);
                            local_c10 = lVar67;
                            do {
                              local_a60 = p_Var57;
                              local_a68 = p_Var56;
                              if (*piVar69 == 0) {
                                dVar98 = *(double *)((long)&local_9a8->_M_p + local_ba0);
                                dVar100 = *(double *)((long)&local_9a8->_M_p + local_c08);
                                dVar103 = dVar98 + dVar100;
                                pp_Var4 = (_func_int **)local_a68[-(long)local_a48.begin.x]._M_p;
                                dVar3 = *(double *)((long)&local_9a8->_M_p + local_b60);
                                dVar101 = dVar103 + (double)pp_Var4 + dVar3;
                                dVar46 = *(double *)((long)&local_9a8->_M_p + local_ba8);
                                dVar48 = *(double *)((long)&local_9a8->_M_p + local_be0);
                                dVar99 = *(double *)((long)&local_9a8->_M_p + lVar93);
                                local_a78 = *(double *)((long)&local_9a8->_M_p + local_bb0);
                                pp_Var7 = (_func_int **)
                                          ((_Alloc_hider *)local_ad8.p)[local_b08]._M_p;
                                pp_Var9 = (_func_int **)((_Alloc_hider *)local_ad8.p)[lVar77]._M_p;
                                lVar60 = (((int)local_9c8 - local_ad8.begin.y) + (int)lVar91) *
                                         local_ad8.jstride;
                                pp_Var11 = (_func_int **)
                                           ((_Alloc_hider *)local_ad8.p)
                                           [(long)&local_990->_M_p + lVar60 + lVar95]._M_p;
                                pp_Var17 = (_func_int **)
                                           ((_Alloc_hider *)local_ad8.p)
                                           [(long)&local_998->_M_p + lVar60 + lVar95]._M_p;
                                pp_Var19 = (_func_int **)
                                           ((_Alloc_hider *)local_ad8.p)[local_b00]._M_p;
                                pp_Var20 = (_func_int **)((_Alloc_hider *)local_ad8.p)[lVar74]._M_p;
                                pp_Var23 = (_func_int **)
                                           ((_Alloc_hider *)local_ad8.p)
                                           [(long)&local_990->_M_p + lVar60 + lVar83]._M_p;
                                pp_Var28 = (_func_int **)
                                           ((_Alloc_hider *)local_ad8.p)
                                           [(long)&local_998->_M_p + lVar60 + lVar83]._M_p;
                                pp_Var29 = (_func_int **)
                                           ((_Alloc_hider *)local_ad8.p)
                                           [(long)&local_9a0->_M_p + lVar60 + lVar95]._M_p;
                                pp_Var30 = (_func_int **)
                                           ((_Alloc_hider *)local_ad8.p)[(long)local_a60]._M_p;
                                pp_Var31 = (_func_int **)
                                           ((_Alloc_hider *)local_ad8.p)[local_b98]._M_p;
                                local_a80 = dVar98 + dVar46;
                                pp_Var32 = (_func_int **)
                                           ((_Alloc_hider *)local_ad8.p)[local_af8]._M_p;
                                pp_Var33 = (_func_int **)
                                           ((_Alloc_hider *)local_ad8.p)
                                           [(long)&local_9a0->_M_p + lVar60 + lVar83]._M_p;
                                pp_Var34 = (_func_int **)
                                           ((_Alloc_hider *)local_ad8.p)[local_c28]._M_p;
                                pp_Var35 = (_func_int **)
                                           ((_Alloc_hider *)local_ad8.p)[local_bb8]._M_p;
                                pp_Var36 = (_func_int **)
                                           ((_Alloc_hider *)local_ad8.p)[local_bd8]._M_p;
                                pp_Var37 = (_func_int **)
                                           ((_Alloc_hider *)local_ad8.p)[local_b48]._M_p;
                                pp_Var38 = (_func_int **)
                                           ((_Alloc_hider *)local_ad8.p)[local_c68._0_8_]._M_p;
                                pp_Var39 = (_func_int **)
                                           ((_Alloc_hider *)local_ad8.p)
                                           [(long)&local_a88->_M_p +
                                            (long)(lVar60 + (long)&local_990->_M_p)]._M_p;
                                pp_Var40 = (_func_int **)
                                           ((_Alloc_hider *)local_ad8.p)
                                           [(long)&local_a88->_M_p +
                                            (long)(lVar60 + (long)&local_998->_M_p)]._M_p;
                                pp_Var41 = (_func_int **)((_Alloc_hider *)local_ad8.p)[lVar61]._M_p;
                                pp_Var42 = (_func_int **)((_Alloc_hider *)local_ad8.p)[lVar71]._M_p;
                                pp_Var43 = (_func_int **)
                                           ((_Alloc_hider *)local_ad8.p)[local_ae8]._M_p;
                                pp_Var44 = (_func_int **)((_Alloc_hider *)local_ad8.p)[lVar82]._M_p;
                                *(double *)(local_4e8 + lVar91 * 8) =
                                     (dVar103 + dVar46 + dVar48) * local_818;
                                local_1a8[lVar91 + -1] =
                                     (FabArrayBase *)
                                     ((dVar101 + dVar46 + dVar48 + dVar99 + local_a78) * local_988);
                                *(double *)(local_6e8 + lVar91 * 8) =
                                     ((double)pp_Var4 + dVar3 + dVar99 + local_a78) * local_818;
                                *(undefined8 *)(local_7e8 + lVar91 * 8) = 0;
                                dVar98 = *pdVar94 -
                                         ((dVar101 * (double)pp_Var44 +
                                          (dVar46 + dVar48 + dVar99 + local_a78) * (double)pp_Var43)
                                          * local_808 +
                                         ((dVar98 + (double)pp_Var4 + dVar46 + dVar99) *
                                          (double)pp_Var42 +
                                         (dVar100 + dVar3 + dVar48 + local_a78) * (double)pp_Var41)
                                         * local_868 +
                                         ((dVar3 + local_a78) * (double)pp_Var40 +
                                         ((double)pp_Var4 + dVar99) * (double)pp_Var39 +
                                         local_a80 * (double)pp_Var38 +
                                         (dVar100 + dVar48) * (double)pp_Var37) *
                                         (double)local_848._0_8_ +
                                         ((dVar48 + local_a78) * (double)pp_Var36 +
                                         (dVar46 + dVar99) * (double)pp_Var35 +
                                         (double)pp_Var32 * (dVar98 + (double)pp_Var4) +
                                         (double)pp_Var34 * (dVar100 + dVar3)) * local_858 +
                                         ((double)pp_Var28 * local_a78 +
                                         (double)pp_Var23 * dVar99 +
                                         (double)pp_Var20 * dVar48 +
                                         (double)pp_Var19 * dVar46 +
                                         (double)pp_Var17 * dVar3 +
                                         (double)pp_Var11 * (double)pp_Var4 +
                                         (double)pp_Var9 * dVar98 + (double)pp_Var7 * dVar100) *
                                         local_828 +
                                         ((dVar99 + local_a78) * (double)pp_Var33 +
                                         (double)pp_Var31 * (dVar46 + dVar48) +
                                         (double)pp_Var30 * dVar103 +
                                         (double)pp_Var29 * ((double)pp_Var4 + dVar3)) * local_838);
                                lVar60 = local_c10 - lVar67;
                              }
                              else {
                                *(undefined8 *)(local_4e8 + lVar91 * 8) = 0;
                                local_1a8[lVar91 + -1] = (FabArrayBase *)0x3ff0000000000000;
                                *(undefined8 *)(local_6e8 + lVar91 * 8) = 0;
                                *(undefined8 *)(local_7e8 + lVar91 * 8) = 0;
                                dVar98 = 0.0;
                                lVar60 = lVar91;
                              }
                              *(double *)(local_5e8 + lVar60 * 8) = dVar98;
                              local_c10 = local_c10 + 1;
                              lVar91 = lVar91 + 1;
                              local_be0 = local_be0 + lVar88;
                              local_c08 = local_c08 + lVar88;
                              local_ba8 = local_ba8 + lVar88;
                              local_ba0 = local_ba0 + lVar88;
                              local_b98 = (long)&((_Alloc_hider *)local_ad8.jstride)->_M_p +
                                          local_b98;
                              local_b48 = (long)&((_Alloc_hider *)local_ad8.jstride)->_M_p +
                                          local_b48;
                              lVar74 = (long)&((_Alloc_hider *)local_ad8.jstride)->_M_p + lVar74;
                              local_b08 = (long)&((_Alloc_hider *)local_ad8.jstride)->_M_p +
                                          local_b08;
                              local_c68._0_8_ =
                                   (long)&((_Alloc_hider *)local_ad8.jstride)->_M_p +
                                   local_c68._0_8_;
                              local_b00 = (long)&((_Alloc_hider *)local_ad8.jstride)->_M_p +
                                          local_b00;
                              lVar77 = (long)&((_Alloc_hider *)local_ad8.jstride)->_M_p + lVar77;
                              local_ae8 = (long)&((_Alloc_hider *)local_ad8.jstride)->_M_p +
                                          local_ae8;
                              lVar82 = (long)&((_Alloc_hider *)local_ad8.jstride)->_M_p + lVar82;
                              lVar61 = (long)&((_Alloc_hider *)local_ad8.jstride)->_M_p + lVar61;
                              local_bd8 = (long)&((_Alloc_hider *)local_ad8.jstride)->_M_p +
                                          local_bd8;
                              local_c28 = (long)&((_Alloc_hider *)local_ad8.jstride)->_M_p +
                                          local_c28;
                              lVar71 = (long)&((_Alloc_hider *)local_ad8.jstride)->_M_p + lVar71;
                              local_bb8 = (long)&((_Alloc_hider *)local_ad8.jstride)->_M_p +
                                          local_bb8;
                              local_af8 = (long)&((_Alloc_hider *)local_ad8.jstride)->_M_p +
                                          local_af8;
                              pdVar94 = pdVar94 + local_968.jstride;
                              local_bb0 = local_bb0 + lVar88;
                              local_b60 = local_b60 + lVar88;
                              lVar93 = lVar93 + lVar88;
                              piVar69 = piVar69 + local_928.jstride;
                              p_Var56 = local_a68 + local_a48.jstride;
                              p_Var57 = (_Alloc_hider *)
                                        ((long)&((_Alloc_hider *)local_ad8.jstride)->_M_p +
                                        (long)&local_a60->_M_p);
                            } while (uVar73 != (uint)lVar91);
                          }
                          local_7e8._0_8_ =
                               (FabArrayBase *)((double)local_5e8._0_8_ / (double)local_1b0);
                          local_9b8 = uVar75;
                          if (1 < (int)uVar50) {
                            lVar60 = 0;
                            auVar47 = local_1b0;
                            do {
                              dVar98 = *(double *)(local_6e8 + lVar60);
                              *(double *)(local_308 + lVar60 + 8) = dVar98 / (double)auVar47;
                              dVar100 = *(double *)(local_4e8 + lVar60 + 8);
                              auVar47 = (undefined1  [8])
                                        (*(double *)((long)local_1a8 + lVar60) -
                                        (dVar98 / (double)auVar47) * dVar100);
                              if (((double)auVar47 == 0.0) && (!NAN((double)auVar47))) {
                                Abort_host(">>>TRIDIAG FAILED");
                              }
                              *(double *)(local_7e8 + lVar60 + 8) =
                                   (-dVar100 * *(double *)(local_7e8 + lVar60) +
                                   *(double *)(local_5e8 + lVar60 + 8)) / (double)auVar47;
                              lVar60 = lVar60 + 8;
                            } while (lVar76 != lVar60);
                          }
                          if (1 < (int)uVar50) {
                            dVar98 = *(double *)(local_7e8 + local_9d0 * 8 + 8);
                            lVar76 = local_9d8;
                            do {
                              dVar98 = (&local_7f0)[lVar76] -
                                       dVar98 * *(double *)(local_308 + lVar76 * 8);
                              (&local_7f0)[lVar76] = dVar98;
                              lVar60 = lVar76 + -1;
                              bVar97 = 0 < lVar76;
                              lVar76 = lVar60;
                            } while (lVar60 != 0 && bVar97);
                          }
                          if (local_bd0 <= iVar54) {
                            puVar66 = (undefined8 *)
                                      ((lVar67 - local_ad8.begin.y) * local_ad8.jstride * 8 +
                                       (lVar85 - local_ad8.begin.z) * local_ad8.kstride * 8 +
                                       local_9f0 + (long)local_ad8.begin.x * -8 + (long)local_ad8.p)
                            ;
                            lVar76 = 0;
                            do {
                              *puVar66 = *(undefined8 *)(local_7e8 + lVar76 * 8);
                              lVar76 = lVar76 + 1;
                              puVar66 = puVar66 + local_ad8.jstride;
                            } while (uVar73 != (uint)lVar76);
                          }
                          uVar75 = (ulong)((int)local_9b8 + 1);
                          local_9f8 = CONCAT44(local_9f8._4_4_,(int)local_9f8 + 1);
                          local_a98 = CONCAT44(local_a98._4_4_,(int)local_a98 + 1);
                        } while ((int)local_9b8 != iVar53);
                      }
                      local_a08 = CONCAT44(local_a08._4_4_,(int)local_a08 + 1);
                      bVar97 = iVar87 != iVar55;
                      iVar87 = iVar87 + 1;
                    } while (bVar97);
                  }
                }
                else if (local_97c == 0) {
                  if (local_bd0 <= iVar54) {
                    lVar76 = (long)iVar52;
                    local_a80 = (double)(ulong)(uVar50 - 2);
                    lVar85 = lVar76 * 8;
                    local_a70 = CONCAT44(local_a70._4_4_,iVar52 + 1);
                    iVar63 = local_bd0 + -1;
                    local_a88 = (_Alloc_hider *)CONCAT44(local_a88._4_4_,iVar87 + -1);
                    local_a90 = (_Alloc_hider *)CONCAT44(local_a90._4_4_,iVar87 + 1);
                    local_a78 = (double)(lVar76 * 4);
                    lVar67 = (long)local_a80 + 1;
                    iVar80 = local_bd0;
                    do {
                      local_bd0 = local_bd0 + 1;
                      if (iVar87 <= iVar55) {
                        lVar60 = (long)iVar80;
                        local_ba0 = (ulong)local_a90 & 0xffffffff;
                        local_ba8 = (ulong)local_a88 & 0xffffffff;
                        iVar59 = iVar87;
                        do {
                          lVar61 = (long)iVar59;
                          if (iVar52 <= iVar53) {
                            lVar82 = (long)local_a48.begin.x;
                            iVar84 = iVar59 - local_ad8.begin.z;
                            lVar77 = (iVar84 + -1) * local_ad8.kstride;
                            local_ae8 = lVar77;
                            lVar91 = (lVar61 - local_a48.begin.z) * local_a48.kstride * 8;
                            lVar88 = ((long)(int)local_ba8 - (long)local_a48.begin.z) *
                                     local_a48.kstride * 8;
                            lVar79 = (iVar84 + 1) * local_ad8.kstride;
                            lVar74 = ((long)iVar63 - (long)local_a48.begin.y) *
                                     local_a48.jstride * 8;
                            lVar93 = (lVar60 - local_a48.begin.y) * local_a48.jstride * 8;
                            lVar72 = lVar74 + lVar91 + lVar82 * -8 + lVar85;
                            lVar74 = lVar74 + lVar88 + lVar82 * -8 + lVar85;
                            lVar91 = lVar91 + lVar93 + lVar82 * -8 + lVar85;
                            lVar82 = lVar93 + lVar88 + lVar82 * -8 + lVar85;
                            lVar81 = local_ad8.kstride * 8;
                            lVar83 = (lVar61 - local_ad8.begin.z) * lVar81;
                            lVar86 = ((int)local_ba0 - local_ad8.begin.z) * lVar81;
                            lVar81 = ((long)(int)local_ba8 - (long)local_ad8.begin.z) * lVar81;
                            lVar65 = ((iVar80 + -1) - local_ad8.begin.y) * local_ad8.jstride;
                            lVar71 = local_ad8.jstride * 8;
                            lVar95 = ((long)iVar63 - (long)local_ad8.begin.y) * lVar71;
                            lVar89 = (local_bd0 - local_ad8.begin.y) * lVar71;
                            lVar71 = (lVar60 - local_ad8.begin.y) * lVar71;
                            lVar62 = (long)local_ad8.begin.x;
                            local_a60 = (_Alloc_hider *)local_ad8.p +
                                        ((iVar80 + 1) - local_ad8.begin.y) * local_ad8.jstride;
                            local_a68 = (_Alloc_hider *)local_ad8.p +
                                        (iVar80 - local_ad8.begin.y) * local_ad8.jstride;
                            lVar88 = lVar95 + lVar83 + lVar62 * -8 + lVar85;
                            lVar93 = lVar95 + lVar86 + lVar62 * -8 + lVar85;
                            lVar95 = lVar95 + lVar81 + lVar62 * -8 + lVar85;
                            lVar83 = lVar83 + lVar89 + lVar62 * -8 + lVar85;
                            lVar68 = lVar89 + lVar86 + lVar62 * -8 + lVar85;
                            lVar89 = lVar89 + lVar81 + lVar62 * -8 + lVar85;
                            lVar86 = lVar86 + lVar71 + lVar62 * -8 + lVar85;
                            lVar62 = lVar71 + lVar81 + lVar62 * -8 + lVar85;
                            lVar81 = 0;
                            lVar71 = lVar76;
                            do {
                              if (*(int *)((long)local_928.p +
                                          lVar81 * 4 +
                                          (lVar61 - local_928.begin.z) * local_928.kstride * 4 +
                                          (lVar60 - local_928.begin.y) * local_928.jstride * 4 +
                                          (long)local_928.begin.x * -4 + (long)local_a78) == 0) {
                                dVar98 = *(double *)((long)local_a48.p + lVar81 * 8 + lVar74 + -8);
                                dVar100 = *(double *)((long)local_a48.p + lVar81 * 8 + lVar74);
                                dVar49 = dVar98 + dVar100;
                                dVar3 = *(double *)((long)local_a48.p + lVar81 * 8 + lVar82 + -8);
                                dVar46 = *(double *)((long)local_a48.p + lVar81 * 8 + lVar82);
                                dVar102 = dVar49 + dVar3 + dVar46;
                                dVar48 = *(double *)((long)local_a48.p + lVar81 * 8 + lVar72 + -8);
                                dVar99 = *(double *)((long)local_a48.p + lVar81 * 8 + lVar72);
                                dVar101 = *(double *)((long)local_a48.p + lVar81 * 8 + lVar91 + -8);
                                dVar103 = *(double *)((long)local_a48.p + lVar81 * 8 + lVar91);
                                lVar78 = (long)(((int)local_a70 - local_ad8.begin.x) + (int)lVar81);
                                pp_Var4 = (_func_int **)
                                          ((_Alloc_hider *)local_ad8.p)[lVar65 + lVar78 + lVar77].
                                          _M_p;
                                dVar5 = *(double *)((long)local_ad8.p + lVar81 * 8 + lVar95 + -8);
                                dVar6 = *(double *)((long)local_ad8.p + lVar81 * 8 + lVar89 + -8);
                                pp_Var7 = (_func_int **)local_a60[lVar78 + lVar77]._M_p;
                                dVar8 = *(double *)((long)local_ad8.p + lVar81 * 8 + lVar93 + -8);
                                pp_Var9 = (_func_int **)
                                          ((_Alloc_hider *)local_ad8.p)[lVar65 + lVar78 + lVar79].
                                          _M_p;
                                dVar10 = *(double *)((long)local_ad8.p + lVar81 * 8 + lVar68 + -8);
                                pp_Var11 = (_func_int **)local_a60[lVar78 + lVar79]._M_p;
                                dVar12 = *(double *)((long)local_ad8.p + lVar81 * 8 + lVar89);
                                dVar13 = *(double *)((long)local_ad8.p + lVar81 * 8 + lVar95);
                                dVar14 = *(double *)((long)local_ad8.p + lVar81 * 8 + lVar93);
                                dVar15 = *(double *)((long)local_ad8.p + lVar81 * 8 + lVar62 + -8);
                                dVar16 = *(double *)((long)local_ad8.p + lVar81 * 8 + lVar68);
                                pp_Var17 = (_func_int **)local_a68[lVar78 + lVar77]._M_p;
                                dVar18 = *(double *)((long)local_ad8.p + lVar81 * 8 + lVar86 + -8);
                                pp_Var19 = (_func_int **)local_a68[lVar78 + lVar79]._M_p;
                                pp_Var20 = (_func_int **)
                                           ((_Alloc_hider *)local_ad8.p)
                                           [lVar65 + lVar78 + iVar84 * local_ad8.kstride]._M_p;
                                dVar21 = *(double *)((long)local_ad8.p + lVar81 * 8 + lVar88 + -8);
                                dVar22 = *(double *)((long)local_ad8.p + lVar81 * 8 + lVar83 + -8);
                                pp_Var23 = (_func_int **)
                                           local_a60[lVar78 + iVar84 * local_ad8.kstride]._M_p;
                                dVar24 = *(double *)((long)local_ad8.p + lVar81 * 8 + lVar83);
                                dVar25 = *(double *)((long)local_ad8.p + lVar81 * 8 + lVar88);
                                dVar26 = *(double *)((long)local_ad8.p + lVar81 * 8 + lVar86);
                                dVar27 = *(double *)((long)local_ad8.p + lVar81 * 8 + lVar62);
                                *(double *)(local_4e8 + lVar81 * 8) =
                                     (dVar98 + dVar3 + dVar48 + dVar101) * local_868;
                                local_1a8[lVar81 + -1] =
                                     (FabArrayBase *)
                                     ((dVar102 + dVar48 + dVar99 + dVar101 + dVar103) * local_988);
                                *(double *)(local_6e8 + lVar81 * 8) =
                                     (dVar100 + dVar46 + dVar99 + dVar103) * local_868;
                                *(undefined8 *)(local_7e8 + lVar81 * 8) = 0;
                                dVar98 = *(double *)
                                          ((long)local_968.p +
                                          lVar81 * 8 +
                                          (lVar61 - local_968.begin.z) *
                                          CONCAT44(local_968.kstride._4_4_,(int)local_968.kstride) *
                                          8 + (lVar60 - local_968.begin.y) * local_968.jstride * 8 +
                                          (long)local_968.begin.x * -8 + lVar85) -
                                         ((dVar102 * dVar27 +
                                          (dVar48 + dVar99 + dVar101 + dVar103) * dVar26) *
                                          local_808 +
                                         ((dVar49 + dVar48 + dVar99) * dVar25 +
                                         (dVar3 + dVar46 + dVar101 + dVar103) * dVar24) * local_818
                                         + ((dVar46 + dVar103) * (double)pp_Var23 +
                                           (dVar3 + dVar101) * dVar22 +
                                           (dVar98 + dVar48) * dVar21 +
                                           (dVar100 + dVar99) * (double)pp_Var20) *
                                           (double)local_848._0_8_ +
                                           ((dVar99 + dVar103) * (double)pp_Var19 +
                                           (dVar48 + dVar101) * dVar18 +
                                           dVar15 * (dVar98 + dVar3) +
                                           (double)pp_Var17 * (dVar100 + dVar46)) * local_858 +
                                           ((double)pp_Var11 * dVar103 +
                                           dVar10 * dVar101 +
                                           (double)pp_Var9 * dVar99 +
                                           dVar8 * dVar48 +
                                           (double)pp_Var7 * dVar46 +
                                           dVar6 * dVar3 +
                                           dVar5 * dVar98 + (double)pp_Var4 * dVar100) * local_828 +
                                           ((dVar101 + dVar103) * dVar16 +
                                           dVar14 * (dVar48 + dVar99) +
                                           dVar13 * dVar49 + dVar12 * (dVar3 + dVar46)) * local_838)
                                ;
                                lVar78 = lVar71 - lVar76;
                              }
                              else {
                                *(undefined8 *)(local_4e8 + lVar81 * 8) = 0;
                                local_1a8[lVar81 + -1] = (FabArrayBase *)0x3ff0000000000000;
                                *(undefined8 *)(local_6e8 + lVar81 * 8) = 0;
                                *(undefined8 *)(local_7e8 + lVar81 * 8) = 0;
                                dVar98 = 0.0;
                                lVar78 = lVar81;
                              }
                              *(double *)(local_5e8 + lVar78 * 8) = dVar98;
                              lVar71 = lVar71 + 1;
                              lVar81 = lVar81 + 1;
                            } while (uVar58 != (uint)lVar81);
                          }
                          local_7e8._0_8_ =
                               (FabArrayBase *)((double)local_5e8._0_8_ / (double)local_1b0);
                          if (1 < (int)uVar50) {
                            lVar72 = 0;
                            auVar47 = local_1b0;
                            do {
                              dVar98 = *(double *)(local_6e8 + lVar72);
                              *(double *)(local_308 + lVar72 + 8) = dVar98 / (double)auVar47;
                              dVar100 = *(double *)(local_4e8 + lVar72 + 8);
                              auVar47 = (undefined1  [8])
                                        (*(double *)((long)local_1a8 + lVar72) -
                                        (dVar98 / (double)auVar47) * dVar100);
                              if (((double)auVar47 == 0.0) && (!NAN((double)auVar47))) {
                                Abort_host(">>>TRIDIAG FAILED");
                              }
                              *(double *)(local_7e8 + lVar72 + 8) =
                                   (-dVar100 * *(double *)(local_7e8 + lVar72) +
                                   *(double *)(local_5e8 + lVar72 + 8)) / (double)auVar47;
                              lVar72 = lVar72 + 8;
                            } while (uVar75 * 8 + -8 != lVar72);
                          }
                          if (1 < (int)uVar50) {
                            dVar98 = *(double *)(local_7e8 + (long)local_a80 * 8 + 8);
                            lVar72 = lVar67;
                            do {
                              dVar98 = (&local_7f0)[lVar72] -
                                       dVar98 * *(double *)(local_308 + lVar72 * 8);
                              (&local_7f0)[lVar72] = dVar98;
                              lVar74 = lVar72 + -1;
                              bVar97 = 0 < lVar72;
                              lVar72 = lVar74;
                            } while (lVar74 != 0 && bVar97);
                          }
                          if (iVar52 <= iVar53) {
                            memcpy((void *)((long)local_ad8.p +
                                           (lVar61 - local_ad8.begin.z) * local_ad8.kstride * 8 +
                                           (lVar60 - local_ad8.begin.y) * local_ad8.jstride * 8 +
                                           (long)local_ad8.begin.x * -8 + lVar85),local_7e8,
                                   (ulong)uVar92 * 8 + 8);
                          }
                          local_ba8 = (ulong)((int)local_ba8 + 1);
                          local_ba0 = (ulong)((int)local_ba0 + 1);
                          bVar97 = iVar59 != iVar55;
                          iVar59 = iVar59 + 1;
                        } while (bVar97);
                      }
                      iVar63 = iVar63 + 1;
                      bVar97 = iVar80 != iVar54;
                      iVar80 = iVar80 + 1;
                    } while (bVar97);
                  }
                }
                else {
                  Abort_host("mlndlap_gauss_seidel_with_line_solve_aa is wrong direction.");
                }
                local_a50 = local_a50 + 1;
              } while (local_a50 < (this->super_MLNodeLinOp).m_smooth_num_sweeps);
            }
            MFIter::operator++((MFIter *)local_8e8);
          } while (local_8c8 < iStack_8c0);
        }
        MFIter::~MFIter((MFIter *)local_8e8);
        goto LAB_006dad1e;
      }
      MFIter::MFIter((MFIter *)local_1b0,(FabArrayBase *)sol,'\0');
      if ((int)local_1a8[3]._0_4_ < (int)local_1a8[4]._0_4_) {
        do {
          BATransformer::operator()
                    ((Box *)&local_ad8,&(local_1a8[0]->boxarray).m_bat,
                     (Box *)((long)*(int *)(*(long *)local_1a8[6] +
                                           (long)(int)local_1a8[3]._0_4_ * 4) * 0x1c +
                            *(long *)&(((local_1a8[0]->boxarray).m_ref.
                                        super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->m_abox).
                                      super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                      _M_impl.super__Vector_impl_data));
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((Array4<const_double> *)local_6e8,(FabArray<amrex::FArrayBox> *)*plVar90,
                     (MFIter *)local_1b0);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((Array4<const_double> *)local_7e8,(FabArray<amrex::FArrayBox> *)plVar90[1],
                     (MFIter *)local_1b0);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((Array4<const_double> *)local_5e8,(FabArray<amrex::FArrayBox> *)plVar90[2],
                     (MFIter *)local_1b0);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<double> *)local_308,&sol->super_FabArray<amrex::FArrayBox>,
                     (MFIter *)local_1b0);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((Array4<const_double> *)local_8e8,&rhs->super_FabArray<amrex::FArrayBox>,
                     (MFIter *)local_1b0);
          FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                    ((Array4<const_int> *)&local_a48,this_00,(MFIter *)local_1b0);
          if (0 < (this->super_MLNodeLinOp).m_smooth_num_sweeps) {
            iVar87 = 0;
            do {
              local_4c8 = (FabArrayBase *)CONCAT44(local_a48.begin.y,local_a48.begin.x);
              uStack_4b4 = local_a48._52_8_;
              local_4e8._16_8_ = local_a48.kstride;
              pFStack_4d0 = (FabArrayBase *)local_a48.nstride;
              local_4e8._0_8_ = local_a48.p;
              local_4e8._8_8_ = local_a48.jstride;
              uStack_474 = local_308._52_8_;
              pFStack_488 = (FabArrayBase *)local_308._32_8_;
              local_498 = (FabArrayBase *)local_308._16_8_;
              pFStack_490 = (FabArrayBase *)local_308._24_8_;
              local_4a8.super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
                   (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)
                   (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)local_308._0_8_;
              pFStack_4a0 = (FabArrayBase *)local_308._8_8_;
              uStack_430 = IStack_6b8.itype;
              iStack_42c = (int)uStack_6b4;
              local_428 = SUB84(uStack_6b4,4);
              uStack_440._0_4_ = local_6c8;
              uStack_440._4_4_ = iStack_6c4;
              uStack_438._0_4_ = iStack_6c0;
              uStack_438._4_4_ = iStack_6bc;
              pFStack_450 = (FabArrayBase *)local_6e8._16_8_;
              pFStack_448 = pFStack_6d0;
              tStack_460.
              super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
              .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
                   (_Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                    )(_Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                      )local_6e8._0_8_;
              local_458 = (FabArrayBase *)local_6e8._8_8_;
              uStack_3e8._0_4_ = iStack_7b8;
              uStack_3e8._4_4_ = (int)uStack_7b4;
              iStack_3e0 = SUB84(uStack_7b4,4);
              iStack_3f8 = (int)local_7e8._32_8_;
              iStack_3f4 = SUB84(local_7e8._32_8_,4);
              iStack_3f0 = iStack_7c0;
              iStack_3ec = iStack_7bc;
              local_408 = (int)local_7e8._16_8_;
              iStack_404 = SUB84(local_7e8._16_8_,4);
              iStack_400 = (int)local_7e8._24_8_;
              iStack_3fc = SUB84(local_7e8._24_8_,4);
              local_418 = (FabArrayBase *)local_7e8._0_8_;
              pFStack_410 = (FabArrayBase *)local_7e8._8_8_;
              uStack_3a0._4_4_ = (int)uStack_5b4;
              iStack_398 = SUB84(uStack_5b4,4);
              iStack_3b0 = (int)local_5e8._32_8_;
              iStack_3ac = SUB84(local_5e8._32_8_,4);
              local_3c0 = (int)local_5e8._16_8_;
              iStack_3bc = SUB84(local_5e8._16_8_,4);
              iStack_3b8 = (int)local_5e8._24_8_;
              iStack_3b4 = SUB84(local_5e8._24_8_,4);
              pFStack_3d0 = (FabArrayBase *)local_5e8._0_8_;
              iStack_3c8 = (int)local_5e8._8_8_;
              iStack_3c4 = SUB84(local_5e8._8_8_,4);
              local_380 = (FabArrayBase *)local_8e8._16_8_;
              pFStack_378 = pFStack_8d0;
              local_390 = (FabArrayBase *)local_8e8._0_8_;
              pFStack_388 = (FabArrayBase *)local_8e8._8_8_;
              local_468.super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
                   (_Head_base<0UL,_amrex::FabArrayBase_*,_false>)
                   (FabArrayBase *)(dVar100 * 0.027777777777777776 * dVar100);
              pFStack_420 = (FabArrayBase *)(dVar3 * 0.027777777777777776 * dVar3);
              local_3d8 = (FabArrayBase *)(dVar98 * 0.027777777777777776 * dVar98);
              Loop<amrex::mlndlap_gauss_seidel_ha(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<int_const>const&,amrex::GpuArray<double,3u>const&)::_lambda(int,int,int)_1_>
                        ((Box *)&local_ad8,(anon_class_408_9_11dfeee2 *)local_4e8);
              iVar87 = iVar87 + 1;
            } while (iVar87 < (this->super_MLNodeLinOp).m_smooth_num_sweeps);
          }
          MFIter::operator++((MFIter *)local_1b0);
        } while ((int)local_1a8[3]._0_4_ < (int)local_1a8[4]._0_4_);
      }
    }
    MFIter::~MFIter((MFIter *)local_1b0);
  }
LAB_006dad1e:
  MLNodeLinOp::nodalSync(&this->super_MLNodeLinOp,local_a58,local_a54,sol);
  return;
}

Assistant:

void
MLNodeLaplacian::Fsmooth (int amrlev, int mglev, MultiFab& sol, const MultiFab& rhs) const
{
    BL_PROFILE("MLNodeLaplacian::Fsmooth()");

    const auto& sigma = m_sigma[amrlev][mglev];
    const auto& stencil = m_stencil[amrlev][mglev];
    const auto dxinvarr = m_geom[amrlev][mglev].InvCellSizeArray();
#if (AMREX_SPACEDIM == 2)
    bool is_rz = m_is_rz;
#endif

    const iMultiFab& dmsk = *m_dirichlet_mask[amrlev][mglev];

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion())
    {
        auto solarr_ma = sol.arrays();
        auto rhsarr_ma = rhs.const_arrays();
        auto dmskarr_ma = dmsk.const_arrays();
        if (m_coarsening_strategy == CoarseningStrategy::RAP)
        {
            auto starr_ma = stencil->const_arrays();
            for (int ns = 0; ns < m_smooth_num_sweeps; ++ns)
            {
                ParallelFor(sol, [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
                {
                    Real Ax = mlndlap_adotx_sten(i,j,k,solarr_ma[box_no],starr_ma[box_no],dmskarr_ma[box_no]);
                    mlndlap_jacobi_sten(i,j,k,solarr_ma[box_no],Ax,rhsarr_ma[box_no],starr_ma[box_no],dmskarr_ma[box_no]);
                });
            }
        }
        else if (sigma[0] == nullptr)
        {
            for (int ns = 0; ns < m_smooth_num_sweeps; ++ns)
            {
                Real const_sigma = m_const_sigma;
                ParallelFor(sol, [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
                {
                    Real Ax = mlndlap_adotx_c(i,j,k,solarr_ma[box_no],const_sigma,dmskarr_ma[box_no],
#if (AMREX_SPACEDIM == 2)
                                              is_rz,
#endif
                                              dxinvarr);
                    mlndlap_jacobi_c(i,j,k, solarr_ma[box_no], Ax, rhsarr_ma[box_no], const_sigma,
                                     dmskarr_ma[box_no], dxinvarr);
                });
            }
        }
        else if ((m_use_harmonic_average && mglev > 0) || m_use_mapped)
        {
            AMREX_D_TERM(MultiArray4<Real const> const& sxarr_ma = sigma[0]->const_arrays();,
                         MultiArray4<Real const> const& syarr_ma = sigma[1]->const_arrays();,
                         MultiArray4<Real const> const& szarr_ma = sigma[2]->const_arrays(););
            for (int ns = 0; ns < m_smooth_num_sweeps; ++ns)
            {
                ParallelFor(sol, [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
                {
                    Real Ax = mlndlap_adotx_ha(i,j,k,solarr_ma[box_no],AMREX_D_DECL(sxarr_ma[box_no],syarr_ma[box_no],szarr_ma[box_no]), dmskarr_ma[box_no],
#if (AMREX_SPACEDIM == 2)
                                               is_rz,
#endif
                                               dxinvarr);
                    mlndlap_jacobi_ha(i,j,k, solarr_ma[box_no], Ax, rhsarr_ma[box_no], AMREX_D_DECL(sxarr_ma[box_no],syarr_ma[box_no],szarr_ma[box_no]),
                                      dmskarr_ma[box_no], dxinvarr);
                });
            }
        }
        else
        {
            auto sarr_ma = sigma[0]->const_arrays();
            for (int ns = 0; ns < m_smooth_num_sweeps; ++ns)
            {
                ParallelFor(sol, [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
                {
                    Real Ax = mlndlap_adotx_aa(i,j,k,solarr_ma[box_no],sarr_ma[box_no],dmskarr_ma[box_no],
#if (AMREX_SPACEDIM == 2)
                                               is_rz,
#endif
                                               dxinvarr);
                    mlndlap_jacobi_aa(i,j,k, solarr_ma[box_no], Ax, rhsarr_ma[box_no], sarr_ma[box_no],
                                      dmskarr_ma[box_no], dxinvarr);
                });
            }
        }

        Gpu::streamSynchronize();
        if (m_smooth_num_sweeps > 1) nodalSync(amrlev, mglev, sol);
    }
    else // cpu
#endif
    {
        bool regular_coarsening = true;
        if (amrlev == 0 && mglev > 0)
        {
            regular_coarsening = mg_coarsen_ratio_vec[mglev-1] == mg_coarsen_ratio;
        }
        if (sigma[0] == nullptr) {
            AMREX_ALWAYS_ASSERT(regular_coarsening);
        }

        if (m_use_gauss_seidel)
        {
            if (m_coarsening_strategy == CoarseningStrategy::RAP)
            {
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
                for (MFIter mfi(sol); mfi.isValid(); ++mfi)
                {
                    const Box& bx = mfi.validbox();
                    Array4<Real> const& solarr = sol.array(mfi);
                    Array4<Real const> const& rhsarr = rhs.const_array(mfi);
                    Array4<Real const> const& starr = stencil->const_array(mfi);
                    Array4<int const> const& dmskarr = dmsk.const_array(mfi);

                    for (int ns = 0; ns < m_smooth_num_sweeps; ++ns) {
                        mlndlap_gauss_seidel_sten(bx,solarr,rhsarr,starr,dmskarr);
                    }
                }
            }
            else if (sigma[0] == nullptr)
            {
                Real const_sigma = m_const_sigma;
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
                for (MFIter mfi(sol); mfi.isValid(); ++mfi)
                {
                    const Box& bx = mfi.validbox();
                    Array4<Real> const& solarr = sol.array(mfi);
                    Array4<Real const> const& rhsarr = rhs.const_array(mfi);
                    Array4<int const> const& dmskarr = dmsk.const_array(mfi);

                    for (int ns = 0; ns < m_smooth_num_sweeps; ++ns) {
                        mlndlap_gauss_seidel_c(bx, solarr, rhsarr,
                                               const_sigma, dmskarr, dxinvarr
#if (AMREX_SPACEDIM == 2)
                                               ,is_rz
#endif
                            );
                    }
                }
            }
            else if ( (m_use_harmonic_average && mglev > 0) || m_use_mapped )
            {
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
                for (MFIter mfi(sol); mfi.isValid(); ++mfi)
                {
                    const Box& bx = mfi.validbox();
                    AMREX_D_TERM(Array4<Real const> const& sxarr = sigma[0]->const_array(mfi);,
                                 Array4<Real const> const& syarr = sigma[1]->const_array(mfi);,
                                 Array4<Real const> const& szarr = sigma[2]->const_array(mfi););
                    Array4<Real> const& solarr = sol.array(mfi);
                    Array4<Real const> const& rhsarr = rhs.const_array(mfi);
                    Array4<int const> const& dmskarr = dmsk.const_array(mfi);

                    for (int ns = 0; ns < m_smooth_num_sweeps; ++ns) {
                        mlndlap_gauss_seidel_ha(bx, solarr, rhsarr,
                                                AMREX_D_DECL(sxarr,syarr,szarr),
                                                dmskarr, dxinvarr
#if (AMREX_SPACEDIM == 2)
                                                ,is_rz
#endif
                            );
                    }
                }
            }
            else
            {
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
                for (MFIter mfi(sol); mfi.isValid(); ++mfi)
                {

                    const Box& bx = mfi.validbox();
                    Array4<Real const> const& sarr = sigma[0]->const_array(mfi);
                    Array4<Real> const& solarr = sol.array(mfi);
                    Array4<Real const> const& rhsarr = rhs.const_array(mfi);
                    Array4<int const> const& dmskarr = dmsk.const_array(mfi);

                    if ( regular_coarsening )
                    {
                        for (int ns = 0; ns < m_smooth_num_sweeps; ++ns) {
                            mlndlap_gauss_seidel_aa(bx, solarr, rhsarr,
                                                    sarr, dmskarr, dxinvarr
#if (AMREX_SPACEDIM == 2)
                                                   ,is_rz
#endif
                                 );
                        }
                    } else {
                        for (int ns = 0; ns < m_smooth_num_sweeps; ++ns) {
                            mlndlap_gauss_seidel_with_line_solve_aa(bx, solarr, rhsarr,
                                                                    sarr, dmskarr, dxinvarr
#if (AMREX_SPACEDIM == 2)
                                                                   ,is_rz
#endif
                                );
                        }
                    }
                }
            }

            nodalSync(amrlev, mglev, sol);
        }
        else
        {
            MultiFab Ax(sol.boxArray(), sol.DistributionMap(), 1, 0);
            Fapply(amrlev, mglev, Ax, sol);

            if (m_coarsening_strategy == CoarseningStrategy::RAP)
            {
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
                for (MFIter mfi(sol,true); mfi.isValid(); ++mfi)
                {
                    const Box& bx = mfi.tilebox();
                    Array4<Real> const& solarr = sol.array(mfi);
                    Array4<Real const> const& Axarr = Ax.const_array(mfi);
                    Array4<Real const> const& rhsarr = rhs.const_array(mfi);
                    Array4<Real const> const& stenarr = stencil->const_array(mfi);
                    Array4<int const> const& dmskarr = dmsk.const_array(mfi);

                    mlndlap_jacobi_sten(bx,solarr,Axarr,rhsarr,stenarr,dmskarr);
                }
            }
            else if (sigma[0] == nullptr)
            {
                Real const_sigma = m_const_sigma;
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
                for (MFIter mfi(sol,true); mfi.isValid(); ++mfi)
                {
                    const Box& bx = mfi.tilebox();
                    Array4<Real> const& solarr = sol.array(mfi);
                    Array4<Real const> const& Axarr = Ax.const_array(mfi);
                    Array4<Real const> const& rhsarr = rhs.const_array(mfi);
                    Array4<int const> const& dmskarr = dmsk.const_array(mfi);

                    mlndlap_jacobi_c (bx, solarr, Axarr, rhsarr, const_sigma,
                                      dmskarr, dxinvarr);
                }
            }
            else if ( (m_use_harmonic_average && mglev > 0) || m_use_mapped )
            {
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
                for (MFIter mfi(sol,true); mfi.isValid(); ++mfi)
                {
                    const Box& bx = mfi.tilebox();
                    AMREX_D_TERM(Array4<Real const> const& sxarr = sigma[0]->const_array(mfi);,
                                 Array4<Real const> const& syarr = sigma[1]->const_array(mfi);,
                                 Array4<Real const> const& szarr = sigma[2]->const_array(mfi););
                    Array4<Real> const& solarr = sol.array(mfi);
                    Array4<Real const> const& Axarr = Ax.const_array(mfi);
                    Array4<Real const> const& rhsarr = rhs.const_array(mfi);
                    Array4<int const> const& dmskarr = dmsk.const_array(mfi);

                    mlndlap_jacobi_ha (bx, solarr, Axarr, rhsarr, AMREX_D_DECL(sxarr,syarr,szarr),
                                       dmskarr, dxinvarr);
                }
            }
            else
            {
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
                for (MFIter mfi(sol,true); mfi.isValid(); ++mfi)
                {
                    const Box& bx = mfi.tilebox();
                    Array4<Real const> const& sarr = sigma[0]->const_array(mfi);
                    Array4<Real> const& solarr = sol.array(mfi);
                    Array4<Real const> const& Axarr = Ax.const_array(mfi);
                    Array4<Real const> const& rhsarr = rhs.const_array(mfi);
                    Array4<int const> const& dmskarr = dmsk.const_array(mfi);

                    mlndlap_jacobi_aa (bx, solarr, Axarr, rhsarr, sarr,
                                       dmskarr, dxinvarr);
                }
            }
        }
    }
}